

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  byte bVar43;
  byte bVar44;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  uint uVar45;
  byte bVar46;
  byte bVar47;
  ulong uVar48;
  undefined8 in_R11;
  byte bVar49;
  bool bVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  ulong uVar53;
  uint uVar54;
  uint uVar104;
  uint uVar105;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar107;
  uint uVar108;
  uint uVar109;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  uint uVar106;
  uint uVar110;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined4 uVar111;
  vint4 bi_2;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar114 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar126;
  float fVar140;
  float fVar141;
  vint4 bi_1;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vint4 ai_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  vint4 bi;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  vint4 ai_1;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  vint4 ai;
  undefined1 auVar205 [16];
  undefined1 auVar208 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [28];
  undefined1 auVar221 [64];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar229;
  undefined1 auVar228 [16];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8ec;
  int local_8d4;
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  undefined1 auStack_890 [16];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  uint local_728;
  uint local_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  RTCFilterFunctionNArguments local_6b0;
  undefined8 local_680;
  undefined4 local_678;
  float local_674;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  uint local_664;
  uint local_660;
  Primitive *local_650;
  ulong local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  ulong local_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar48 = (ulong)(byte)prim[1];
  fVar126 = *(float *)(prim + uVar48 * 0x19 + 0x12);
  auVar58 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar48 * 0x19 + 6));
  auVar148._0_4_ = fVar126 * (ray->dir).field_0.m128[0];
  auVar148._4_4_ = fVar126 * (ray->dir).field_0.m128[1];
  auVar148._8_4_ = fVar126 * (ray->dir).field_0.m128[2];
  auVar148._12_4_ = fVar126 * (ray->dir).field_0.m128[3];
  auVar60 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 4 + 6)));
  auVar194._0_4_ = fVar126 * auVar58._0_4_;
  auVar194._4_4_ = fVar126 * auVar58._4_4_;
  auVar194._8_4_ = fVar126 * auVar58._8_4_;
  auVar194._12_4_ = fVar126 * auVar58._12_4_;
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 5 + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 6 + 6)));
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xb + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar61 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xc + 6)));
  auVar61 = vcvtdq2ps_avx(auVar61);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xd + 6)));
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x12 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x13 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x14 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar226._4_4_ = auVar148._0_4_;
  auVar226._0_4_ = auVar148._0_4_;
  auVar226._8_4_ = auVar148._0_4_;
  auVar226._12_4_ = auVar148._0_4_;
  auVar65 = vshufps_avx(auVar148,auVar148,0x55);
  auVar55 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar126 = auVar55._0_4_;
  auVar185._0_4_ = fVar126 * auVar59._0_4_;
  fVar140 = auVar55._4_4_;
  auVar185._4_4_ = fVar140 * auVar59._4_4_;
  fVar141 = auVar55._8_4_;
  auVar185._8_4_ = fVar141 * auVar59._8_4_;
  fVar142 = auVar55._12_4_;
  auVar185._12_4_ = fVar142 * auVar59._12_4_;
  auVar127._0_4_ = auVar64._0_4_ * fVar126;
  auVar127._4_4_ = auVar64._4_4_ * fVar140;
  auVar127._8_4_ = auVar64._8_4_ * fVar141;
  auVar127._12_4_ = auVar64._12_4_ * fVar142;
  auVar112._0_4_ = auVar13._0_4_ * fVar126;
  auVar112._4_4_ = auVar13._4_4_ * fVar140;
  auVar112._8_4_ = auVar13._8_4_ * fVar141;
  auVar112._12_4_ = auVar13._12_4_ * fVar142;
  auVar55 = vfmadd231ps_fma(auVar185,auVar65,auVar58);
  auVar57 = vfmadd231ps_fma(auVar127,auVar65,auVar61);
  auVar65 = vfmadd231ps_fma(auVar112,auVar66,auVar65);
  auVar56 = vfmadd231ps_fma(auVar55,auVar226,auVar60);
  auVar57 = vfmadd231ps_fma(auVar57,auVar226,auVar63);
  auVar112 = vfmadd231ps_fma(auVar65,auVar62,auVar226);
  auVar227._4_4_ = auVar194._0_4_;
  auVar227._0_4_ = auVar194._0_4_;
  auVar227._8_4_ = auVar194._0_4_;
  auVar227._12_4_ = auVar194._0_4_;
  auVar65 = vshufps_avx(auVar194,auVar194,0x55);
  auVar55 = vshufps_avx(auVar194,auVar194,0xaa);
  fVar126 = auVar55._0_4_;
  auVar195._0_4_ = fVar126 * auVar59._0_4_;
  fVar140 = auVar55._4_4_;
  auVar195._4_4_ = fVar140 * auVar59._4_4_;
  fVar141 = auVar55._8_4_;
  auVar195._8_4_ = fVar141 * auVar59._8_4_;
  fVar142 = auVar55._12_4_;
  auVar195._12_4_ = fVar142 * auVar59._12_4_;
  auVar167._0_4_ = auVar64._0_4_ * fVar126;
  auVar167._4_4_ = auVar64._4_4_ * fVar140;
  auVar167._8_4_ = auVar64._8_4_ * fVar141;
  auVar167._12_4_ = auVar64._12_4_ * fVar142;
  auVar149._0_4_ = auVar13._0_4_ * fVar126;
  auVar149._4_4_ = auVar13._4_4_ * fVar140;
  auVar149._8_4_ = auVar13._8_4_ * fVar141;
  auVar149._12_4_ = auVar13._12_4_ * fVar142;
  auVar58 = vfmadd231ps_fma(auVar195,auVar65,auVar58);
  auVar59 = vfmadd231ps_fma(auVar167,auVar65,auVar61);
  auVar61 = vfmadd231ps_fma(auVar149,auVar65,auVar66);
  auVar64 = vfmadd231ps_fma(auVar58,auVar227,auVar60);
  auVar66 = vfmadd231ps_fma(auVar59,auVar227,auVar63);
  auVar13 = vfmadd231ps_fma(auVar61,auVar227,auVar62);
  auVar218._8_4_ = 0x7fffffff;
  auVar218._0_8_ = 0x7fffffff7fffffff;
  auVar218._12_4_ = 0x7fffffff;
  auVar60 = vandps_avx(auVar218,auVar56);
  auVar211._8_4_ = 0x219392ef;
  auVar211._0_8_ = 0x219392ef219392ef;
  auVar211._12_4_ = 0x219392ef;
  uVar53 = vcmpps_avx512vl(auVar60,auVar211,1);
  bVar50 = (bool)((byte)uVar53 & 1);
  auVar55._0_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar56._0_4_;
  bVar50 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar55._4_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar56._4_4_;
  bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar55._8_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar56._8_4_;
  bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar55._12_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar56._12_4_;
  auVar60 = vandps_avx(auVar218,auVar57);
  uVar53 = vcmpps_avx512vl(auVar60,auVar211,1);
  bVar50 = (bool)((byte)uVar53 & 1);
  auVar56._0_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar57._0_4_;
  bVar50 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar57._4_4_;
  bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar57._8_4_;
  bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar56._12_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar57._12_4_;
  auVar60 = vandps_avx(auVar218,auVar112);
  uVar53 = vcmpps_avx512vl(auVar60,auVar211,1);
  bVar50 = (bool)((byte)uVar53 & 1);
  auVar57._0_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar112._0_4_;
  bVar50 = (bool)((byte)(uVar53 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar112._4_4_;
  bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar112._8_4_;
  bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar50 * 0x219392ef | (uint)!bVar50 * auVar112._12_4_;
  auVar58 = vrcp14ps_avx512vl(auVar55);
  auVar212._8_4_ = 0x3f800000;
  auVar212._0_8_ = 0x3f8000003f800000;
  auVar212._12_4_ = 0x3f800000;
  auVar60 = vfnmadd213ps_fma(auVar55,auVar58,auVar212);
  auVar63 = vfmadd132ps_fma(auVar60,auVar58,auVar58);
  auVar58 = vrcp14ps_avx512vl(auVar56);
  auVar60 = vfnmadd213ps_fma(auVar56,auVar58,auVar212);
  auVar61 = vfmadd132ps_fma(auVar60,auVar58,auVar58);
  auVar59 = vrcp14ps_avx512vl(auVar57);
  auVar58 = vfnmadd213ps_fma(auVar57,auVar59,auVar212);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar48 * 7 + 6);
  auVar60 = vpmovsxwd_avx(auVar60);
  auVar62 = vfmadd132ps_fma(auVar58,auVar59,auVar59);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar59 = vsubps_avx(auVar60,auVar64);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar48 * 9 + 6);
  auVar60 = vpmovsxwd_avx(auVar58);
  auVar205._0_4_ = auVar63._0_4_ * auVar59._0_4_;
  auVar205._4_4_ = auVar63._4_4_ * auVar59._4_4_;
  auVar205._8_4_ = auVar63._8_4_ * auVar59._8_4_;
  auVar205._12_4_ = auVar63._12_4_ * auVar59._12_4_;
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar58 = vsubps_avx(auVar60,auVar64);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar48 * 0xe + 6);
  auVar60 = vpmovsxwd_avx(auVar59);
  auVar186._0_4_ = auVar63._0_4_ * auVar58._0_4_;
  auVar186._4_4_ = auVar63._4_4_ * auVar58._4_4_;
  auVar186._8_4_ = auVar63._8_4_ * auVar58._8_4_;
  auVar186._12_4_ = auVar63._12_4_ * auVar58._12_4_;
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar60 = vsubps_avx(auVar60,auVar66);
  auVar196._0_4_ = auVar61._0_4_ * auVar60._0_4_;
  auVar196._4_4_ = auVar61._4_4_ * auVar60._4_4_;
  auVar196._8_4_ = auVar61._8_4_ * auVar60._8_4_;
  auVar196._12_4_ = auVar61._12_4_ * auVar60._12_4_;
  auVar59 = vpbroadcastd_avx512vl();
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar60 = vpmovsxwd_avx(auVar63);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar60 = vsubps_avx(auVar60,auVar66);
  auVar128._0_4_ = auVar61._0_4_ * auVar60._0_4_;
  auVar128._4_4_ = auVar61._4_4_ * auVar60._4_4_;
  auVar128._8_4_ = auVar61._8_4_ * auVar60._8_4_;
  auVar128._12_4_ = auVar61._12_4_ * auVar60._12_4_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar48 * 0x15 + 6);
  auVar60 = vpmovsxwd_avx(auVar61);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar60 = vsubps_avx(auVar60,auVar13);
  auVar168._0_4_ = auVar62._0_4_ * auVar60._0_4_;
  auVar168._4_4_ = auVar62._4_4_ * auVar60._4_4_;
  auVar168._8_4_ = auVar62._8_4_ * auVar60._8_4_;
  auVar168._12_4_ = auVar62._12_4_ * auVar60._12_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar48 * 0x17 + 6);
  auVar60 = vpmovsxwd_avx(auVar64);
  auVar60 = vcvtdq2ps_avx(auVar60);
  auVar60 = vsubps_avx(auVar60,auVar13);
  auVar113._0_4_ = auVar62._0_4_ * auVar60._0_4_;
  auVar113._4_4_ = auVar62._4_4_ * auVar60._4_4_;
  auVar113._8_4_ = auVar62._8_4_ * auVar60._8_4_;
  auVar113._12_4_ = auVar62._12_4_ * auVar60._12_4_;
  auVar60 = vpminsd_avx(auVar205,auVar186);
  auVar58 = vpminsd_avx(auVar196,auVar128);
  auVar60 = vmaxps_avx(auVar60,auVar58);
  auVar58 = vpminsd_avx(auVar168,auVar113);
  uVar111 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar62._4_4_ = uVar111;
  auVar62._0_4_ = uVar111;
  auVar62._8_4_ = uVar111;
  auVar62._12_4_ = uVar111;
  auVar58 = vmaxps_avx512vl(auVar58,auVar62);
  auVar60 = vmaxps_avx(auVar60,auVar58);
  auVar66._8_4_ = 0x3f7ffffa;
  auVar66._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar66._12_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar60,auVar66);
  auVar60 = vpmaxsd_avx(auVar205,auVar186);
  auVar58 = vpmaxsd_avx(auVar196,auVar128);
  auVar60 = vminps_avx(auVar60,auVar58);
  auVar58 = vpmaxsd_avx(auVar168,auVar113);
  fVar126 = ray->tfar;
  auVar13._4_4_ = fVar126;
  auVar13._0_4_ = fVar126;
  auVar13._8_4_ = fVar126;
  auVar13._12_4_ = fVar126;
  auVar58 = vminps_avx512vl(auVar58,auVar13);
  auVar60 = vminps_avx(auVar60,auVar58);
  auVar65._8_4_ = 0x3f800003;
  auVar65._0_8_ = 0x3f8000033f800003;
  auVar65._12_4_ = 0x3f800003;
  auVar60 = vmulps_avx512vl(auVar60,auVar65);
  uVar14 = vcmpps_avx512vl(local_2e0,auVar60,2);
  uVar16 = vpcmpgtd_avx512vl(auVar59,_DAT_01f4ad30);
  local_648 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)((byte)uVar14 & 0xf & (byte)uVar16));
  local_650 = prim;
LAB_0182019e:
  if (local_648 == 0) {
LAB_01822840:
    return local_648 != 0;
  }
  lVar18 = 0;
  for (uVar53 = local_648; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    lVar18 = lVar18 + 1;
  }
  local_8c8 = (ulong)*(uint *)(prim + 2);
  local_8d0 = (ulong)*(uint *)(prim + lVar18 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[local_8c8].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8d0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar18 = *(long *)&pGVar3[1].time_range.upper;
  auVar60 = *(undefined1 (*) [16])(lVar18 + (long)p_Var4 * uVar53);
  auVar58 = *(undefined1 (*) [16])(lVar18 + (uVar53 + 1) * (long)p_Var4);
  auVar59 = *(undefined1 (*) [16])(lVar18 + (uVar53 + 2) * (long)p_Var4);
  local_4a8 = local_648 - 1 & local_648;
  auVar63 = *(undefined1 (*) [16])(lVar18 + (uVar53 + 3) * (long)p_Var4);
  if (local_4a8 != 0) {
    uVar48 = local_4a8 - 1 & local_4a8;
    for (uVar53 = local_4a8; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar48 != 0) {
      for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar197._0_4_ = auVar60._0_4_ + auVar58._0_4_ + auVar59._0_4_ + auVar63._0_4_;
  auVar197._4_4_ = auVar60._4_4_ + auVar58._4_4_ + auVar59._4_4_ + auVar63._4_4_;
  auVar197._8_4_ = auVar60._8_4_ + auVar58._8_4_ + auVar59._8_4_ + auVar63._8_4_;
  auVar197._12_4_ = auVar60._12_4_ + auVar58._12_4_ + auVar59._12_4_ + auVar63._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar19._8_4_ = 0x3e800000;
  auVar19._0_8_ = 0x3e8000003e800000;
  auVar19._12_4_ = 0x3e800000;
  auVar61 = vmulps_avx512vl(auVar197,auVar19);
  auVar61 = vsubps_avx(auVar61,(undefined1  [16])aVar1);
  auVar61 = vdpps_avx(auVar61,(undefined1  [16])aVar2,0x7f);
  auVar64 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar219._4_12_ = ZEXT812(0) << 0x20;
  auVar219._0_4_ = auVar64._0_4_;
  auVar62 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar219);
  auVar64 = vfnmadd213ss_fma(auVar62,auVar64,ZEXT416(0x40000000));
  fVar126 = auVar61._0_4_ * auVar62._0_4_ * auVar64._0_4_;
  local_500 = ZEXT416((uint)fVar126);
  auVar198._4_4_ = fVar126;
  auVar198._0_4_ = fVar126;
  auVar198._8_4_ = fVar126;
  auVar198._12_4_ = fVar126;
  fStack_350 = fVar126;
  _local_360 = auVar198;
  fStack_34c = fVar126;
  fStack_348 = fVar126;
  fStack_344 = fVar126;
  auVar61 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar198);
  auVar61 = vblendps_avx(auVar61,ZEXT816(0) << 0x40,8);
  auVar60 = vsubps_avx(auVar60,auVar61);
  auVar67 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[0]));
  auVar240 = ZEXT3264(auVar67);
  auVar59 = vsubps_avx(auVar59,auVar61);
  local_6e0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar237 = ZEXT3264(local_6e0);
  local_760 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
  auVar239 = ZEXT3264(local_760);
  auVar58 = vsubps_avx(auVar58,auVar61);
  auVar63 = vsubps_avx(auVar63,auVar61);
  uVar111 = auVar60._0_4_;
  local_5c0._4_4_ = uVar111;
  local_5c0._0_4_ = uVar111;
  local_5c0._8_4_ = uVar111;
  local_5c0._12_4_ = uVar111;
  local_5c0._16_4_ = uVar111;
  local_5c0._20_4_ = uVar111;
  local_5c0._24_4_ = uVar111;
  local_5c0._28_4_ = uVar111;
  auVar221 = ZEXT3264(local_5c0);
  auVar70._8_4_ = 1;
  auVar70._0_8_ = 0x100000001;
  auVar70._12_4_ = 1;
  auVar70._16_4_ = 1;
  auVar70._20_4_ = 1;
  auVar70._24_4_ = 1;
  auVar70._28_4_ = 1;
  local_420 = ZEXT1632(auVar60);
  local_5e0 = vpermps_avx2(auVar70,local_420);
  auVar223 = ZEXT3264(local_5e0);
  auVar71._8_4_ = 2;
  auVar71._0_8_ = 0x200000002;
  auVar71._12_4_ = 2;
  auVar71._16_4_ = 2;
  auVar71._20_4_ = 2;
  auVar71._24_4_ = 2;
  auVar71._28_4_ = 2;
  local_600 = vpermps_avx2(auVar71,local_420);
  auVar225 = ZEXT3264(local_600);
  auVar72._8_4_ = 3;
  auVar72._0_8_ = 0x300000003;
  auVar72._12_4_ = 3;
  auVar72._16_4_ = 3;
  auVar72._20_4_ = 3;
  auVar72._24_4_ = 3;
  auVar72._28_4_ = 3;
  local_620 = vpermps_avx2(auVar72,local_420);
  uVar111 = auVar58._0_4_;
  local_4a0._4_4_ = uVar111;
  local_4a0._0_4_ = uVar111;
  local_4a0._8_4_ = uVar111;
  local_4a0._12_4_ = uVar111;
  local_4a0._16_4_ = uVar111;
  local_4a0._20_4_ = uVar111;
  local_4a0._24_4_ = uVar111;
  local_4a0._28_4_ = uVar111;
  local_460 = ZEXT1632(auVar58);
  local_640 = vpermps_avx2(auVar70,local_460);
  local_780 = vpermps_avx512vl(auVar71,local_460);
  auVar242 = ZEXT3264(local_780);
  local_7a0 = vpermps_avx2(auVar72,local_460);
  auVar230 = ZEXT3264(local_7a0);
  auVar217 = ZEXT3264(local_620);
  auVar209 = ZEXT3264(local_640);
  local_7c0 = vbroadcastss_avx512vl(auVar59);
  auVar231 = ZEXT3264(local_7c0);
  local_440 = ZEXT1632(auVar59);
  local_7e0 = vpermps_avx512vl(auVar70,local_440);
  auVar232 = ZEXT3264(local_7e0);
  local_800 = vpermps_avx512vl(auVar71,local_440);
  auVar233 = ZEXT3264(local_800);
  local_820 = vpermps_avx512vl(auVar72,local_440);
  auVar234 = ZEXT3264(local_820);
  local_840 = vbroadcastss_avx512vl(auVar63);
  auVar235 = ZEXT3264(local_840);
  _local_480 = ZEXT1632(auVar63);
  local_860 = vpermps_avx512vl(auVar70,_local_480);
  auVar236 = ZEXT3264(local_860);
  local_880 = vpermps_avx512vl(auVar71,_local_480);
  auVar238 = ZEXT3264(local_880);
  local_720 = vpermps_avx512vl(auVar72,_local_480);
  auVar241 = ZEXT3264(local_720);
  auVar193 = ZEXT3264(local_4a0);
  auVar68 = vpermps_avx2(auVar71,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                    CONCAT48(aVar2.z * aVar2.z,
                                                             CONCAT44(aVar2.y * aVar2.y,
                                                                      aVar2.x * aVar2.x)))));
  auVar68 = vfmadd231ps_avx512vl(auVar68,local_6e0,local_6e0);
  local_1e0 = vfmadd231ps_avx512vl(auVar68,auVar67,auVar67);
  auVar68._8_4_ = 0x7fffffff;
  auVar68._0_8_ = 0x7fffffff7fffffff;
  auVar68._12_4_ = 0x7fffffff;
  auVar68._16_4_ = 0x7fffffff;
  auVar68._20_4_ = 0x7fffffff;
  auVar68._24_4_ = 0x7fffffff;
  auVar68._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar68);
  local_200 = local_1e0;
  uVar45 = 0;
  bVar49 = 0;
  local_8ec = 1;
  local_2d0 = ZEXT816(0x3f80000000000000);
  do {
    auVar60 = vmovshdup_avx(local_2d0);
    auVar60 = vsubps_avx(auVar60,local_2d0);
    fVar126 = auVar60._0_4_;
    fVar144 = fVar126 * 0.04761905;
    local_8a0._0_4_ = local_2d0._0_4_;
    local_8a0._4_4_ = local_8a0._0_4_;
    fStack_898 = (float)local_8a0._0_4_;
    fStack_894 = (float)local_8a0._0_4_;
    register0x000012d0 = local_8a0._0_4_;
    register0x000012d4 = local_8a0._0_4_;
    register0x000012d8 = local_8a0._0_4_;
    register0x000012dc = local_8a0._0_4_;
    auVar199._4_4_ = fVar126;
    auVar199._0_4_ = fVar126;
    auVar199._8_4_ = fVar126;
    auVar199._12_4_ = fVar126;
    local_8c0._16_4_ = fVar126;
    local_8c0._0_16_ = auVar199;
    local_8c0._20_4_ = fVar126;
    local_8c0._24_4_ = fVar126;
    local_8c0._28_4_ = fVar126;
    auVar60 = vfmadd231ps_fma(_local_8a0,local_8c0,_DAT_01f7b040);
    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar68 = vsubps_avx512vl(auVar69,ZEXT1632(auVar60));
    fVar126 = auVar60._0_4_;
    fVar140 = auVar60._4_4_;
    auVar80._4_4_ = auVar193._4_4_ * fVar140;
    auVar80._0_4_ = auVar193._0_4_ * fVar126;
    fVar141 = auVar60._8_4_;
    auVar80._8_4_ = auVar193._8_4_ * fVar141;
    fVar142 = auVar60._12_4_;
    auVar80._12_4_ = auVar193._12_4_ * fVar142;
    auVar80._16_4_ = auVar193._16_4_ * 0.0;
    auVar80._20_4_ = auVar193._20_4_ * 0.0;
    auVar80._24_4_ = auVar193._24_4_ * 0.0;
    auVar80._28_4_ = DAT_01f7b040._28_4_;
    auVar73._4_4_ = auVar209._4_4_ * fVar140;
    auVar73._0_4_ = auVar209._0_4_ * fVar126;
    auVar73._8_4_ = auVar209._8_4_ * fVar141;
    auVar73._12_4_ = auVar209._12_4_ * fVar142;
    auVar73._16_4_ = auVar209._16_4_ * 0.0;
    auVar73._20_4_ = auVar209._20_4_ * 0.0;
    auVar73._24_4_ = auVar209._24_4_ * 0.0;
    auVar73._28_4_ = local_8a0._0_4_;
    auVar67 = vmulps_avx512vl(auVar242._0_32_,ZEXT1632(auVar60));
    auVar210._0_4_ = auVar230._0_4_ * fVar126;
    auVar210._4_4_ = auVar230._4_4_ * fVar140;
    auVar210._8_4_ = auVar230._8_4_ * fVar141;
    auVar210._12_4_ = auVar230._12_4_ * fVar142;
    auVar210._16_4_ = auVar230._16_4_ * 0.0;
    auVar210._20_4_ = auVar230._20_4_ * 0.0;
    auVar210._28_36_ = auVar209._28_36_;
    auVar210._24_4_ = auVar230._24_4_ * 0.0;
    auVar58 = vfmadd231ps_fma(auVar80,auVar68,auVar221._0_32_);
    auVar59 = vfmadd231ps_fma(auVar73,auVar68,auVar223._0_32_);
    auVar63 = vfmadd231ps_fma(auVar67,auVar68,auVar225._0_32_);
    auVar61 = vfmadd231ps_fma(auVar210._0_32_,auVar68,auVar217._0_32_);
    auVar67 = vmulps_avx512vl(auVar231._0_32_,ZEXT1632(auVar60));
    auVar74 = ZEXT1632(auVar60);
    auVar70 = vmulps_avx512vl(auVar232._0_32_,auVar74);
    auVar71 = vmulps_avx512vl(auVar233._0_32_,auVar74);
    auVar72 = vmulps_avx512vl(auVar234._0_32_,auVar74);
    auVar64 = vfmadd231ps_fma(auVar67,auVar68,auVar193._0_32_);
    auVar62 = vfmadd231ps_fma(auVar70,auVar68,auVar209._0_32_);
    auVar67 = vfmadd231ps_avx512vl(auVar71,auVar68,auVar242._0_32_);
    auVar66 = vfmadd231ps_fma(auVar72,auVar68,auVar230._0_32_);
    auVar70 = vmulps_avx512vl(auVar235._0_32_,auVar74);
    auVar71 = vmulps_avx512vl(auVar236._0_32_,auVar74);
    auVar72 = vmulps_avx512vl(auVar238._0_32_,auVar74);
    auVar73 = vmulps_avx512vl(auVar241._0_32_,auVar74);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar68,auVar231._0_32_);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar68,auVar232._0_32_);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar68,auVar233._0_32_);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar68,auVar234._0_32_);
    auVar193._28_36_ = auVar230._28_36_;
    auVar193._0_28_ =
         ZEXT1628(CONCAT412(fVar142 * auVar64._12_4_,
                            CONCAT48(fVar141 * auVar64._8_4_,
                                     CONCAT44(fVar140 * auVar64._4_4_,fVar126 * auVar64._0_4_))));
    auVar74 = vmulps_avx512vl(auVar74,ZEXT1632(auVar62));
    auVar75 = vmulps_avx512vl(ZEXT1632(auVar60),auVar67);
    auVar76 = vmulps_avx512vl(ZEXT1632(auVar60),ZEXT1632(auVar66));
    auVar60 = vfmadd231ps_fma(auVar193._0_32_,auVar68,ZEXT1632(auVar58));
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar68,ZEXT1632(auVar59));
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar68,ZEXT1632(auVar63));
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar68,ZEXT1632(auVar61));
    auVar81._0_4_ = auVar70._0_4_ * fVar126;
    auVar81._4_4_ = auVar70._4_4_ * fVar140;
    auVar81._8_4_ = auVar70._8_4_ * fVar141;
    auVar81._12_4_ = auVar70._12_4_ * fVar142;
    auVar81._16_4_ = auVar70._16_4_ * 0.0;
    auVar81._20_4_ = auVar70._20_4_ * 0.0;
    auVar81._24_4_ = auVar70._24_4_ * 0.0;
    auVar81._28_4_ = 0;
    auVar77._4_4_ = auVar71._4_4_ * fVar140;
    auVar77._0_4_ = auVar71._0_4_ * fVar126;
    auVar77._8_4_ = auVar71._8_4_ * fVar141;
    auVar77._12_4_ = auVar71._12_4_ * fVar142;
    auVar77._16_4_ = auVar71._16_4_ * 0.0;
    auVar77._20_4_ = auVar71._20_4_ * 0.0;
    auVar77._24_4_ = auVar71._24_4_ * 0.0;
    auVar77._28_4_ = auVar70._28_4_;
    auVar78._4_4_ = auVar72._4_4_ * fVar140;
    auVar78._0_4_ = auVar72._0_4_ * fVar126;
    auVar78._8_4_ = auVar72._8_4_ * fVar141;
    auVar78._12_4_ = auVar72._12_4_ * fVar142;
    auVar78._16_4_ = auVar72._16_4_ * 0.0;
    auVar78._20_4_ = auVar72._20_4_ * 0.0;
    auVar78._24_4_ = auVar72._24_4_ * 0.0;
    auVar78._28_4_ = auVar71._28_4_;
    auVar79._4_4_ = auVar73._4_4_ * fVar140;
    auVar79._0_4_ = auVar73._0_4_ * fVar126;
    auVar79._8_4_ = auVar73._8_4_ * fVar141;
    auVar79._12_4_ = auVar73._12_4_ * fVar142;
    auVar79._16_4_ = auVar73._16_4_ * 0.0;
    auVar79._20_4_ = auVar73._20_4_ * 0.0;
    auVar79._24_4_ = auVar73._24_4_ * 0.0;
    auVar79._28_4_ = auVar72._28_4_;
    auVar58 = vfmadd231ps_fma(auVar81,auVar68,ZEXT1632(auVar64));
    auVar59 = vfmadd231ps_fma(auVar77,auVar68,ZEXT1632(auVar62));
    auVar63 = vfmadd231ps_fma(auVar78,auVar68,auVar67);
    auVar61 = vfmadd231ps_fma(auVar79,auVar68,ZEXT1632(auVar66));
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar142 * auVar58._12_4_,
                                                 CONCAT48(fVar141 * auVar58._8_4_,
                                                          CONCAT44(fVar140 * auVar58._4_4_,
                                                                   fVar126 * auVar58._0_4_)))),
                              auVar68,ZEXT1632(auVar60));
    auVar77 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar59._12_4_ * fVar142,
                                            CONCAT48(auVar59._8_4_ * fVar141,
                                                     CONCAT44(auVar59._4_4_ * fVar140,
                                                              auVar59._0_4_ * fVar126)))),auVar68,
                         auVar74);
    auVar78 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar63._12_4_ * fVar142,
                                            CONCAT48(auVar63._8_4_ * fVar141,
                                                     CONCAT44(auVar63._4_4_ * fVar140,
                                                              auVar63._0_4_ * fVar126)))),auVar68,
                         auVar75);
    auVar70 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar61._12_4_ * fVar142,
                                            CONCAT48(auVar61._8_4_ * fVar141,
                                                     CONCAT44(auVar61._4_4_ * fVar140,
                                                              auVar61._0_4_ * fVar126)))),auVar76,
                         auVar68);
    auVar68 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar60));
    auVar67 = vsubps_avx512vl(ZEXT1632(auVar59),auVar74);
    auVar71 = vsubps_avx512vl(ZEXT1632(auVar63),auVar75);
    auVar72 = vsubps_avx512vl(ZEXT1632(auVar61),auVar76);
    auVar94._0_4_ = fVar144 * auVar68._0_4_ * 3.0;
    auVar94._4_4_ = fVar144 * auVar68._4_4_ * 3.0;
    auVar94._8_4_ = fVar144 * auVar68._8_4_ * 3.0;
    auVar94._12_4_ = fVar144 * auVar68._12_4_ * 3.0;
    auVar94._16_4_ = fVar144 * auVar68._16_4_ * 3.0;
    auVar94._20_4_ = fVar144 * auVar68._20_4_ * 3.0;
    auVar94._24_4_ = fVar144 * auVar68._24_4_ * 3.0;
    auVar94._28_4_ = 0;
    auVar95._0_4_ = fVar144 * auVar67._0_4_ * 3.0;
    auVar95._4_4_ = fVar144 * auVar67._4_4_ * 3.0;
    auVar95._8_4_ = fVar144 * auVar67._8_4_ * 3.0;
    auVar95._12_4_ = fVar144 * auVar67._12_4_ * 3.0;
    auVar95._16_4_ = fVar144 * auVar67._16_4_ * 3.0;
    auVar95._20_4_ = fVar144 * auVar67._20_4_ * 3.0;
    auVar95._24_4_ = fVar144 * auVar67._24_4_ * 3.0;
    auVar95._28_4_ = 0;
    auVar96._0_4_ = fVar144 * auVar71._0_4_ * 3.0;
    auVar96._4_4_ = fVar144 * auVar71._4_4_ * 3.0;
    auVar96._8_4_ = fVar144 * auVar71._8_4_ * 3.0;
    auVar96._12_4_ = fVar144 * auVar71._12_4_ * 3.0;
    auVar96._16_4_ = fVar144 * auVar71._16_4_ * 3.0;
    auVar96._20_4_ = fVar144 * auVar71._20_4_ * 3.0;
    auVar96._24_4_ = fVar144 * auVar71._24_4_ * 3.0;
    auVar96._28_4_ = 0;
    fVar126 = auVar72._0_4_ * 3.0 * fVar144;
    fVar140 = auVar72._4_4_ * 3.0 * fVar144;
    auVar86._4_4_ = fVar140;
    auVar86._0_4_ = fVar126;
    fVar141 = auVar72._8_4_ * 3.0 * fVar144;
    auVar86._8_4_ = fVar141;
    fVar142 = auVar72._12_4_ * 3.0 * fVar144;
    auVar86._12_4_ = fVar142;
    fVar143 = auVar72._16_4_ * 3.0 * fVar144;
    auVar86._16_4_ = fVar143;
    fVar145 = auVar72._20_4_ * 3.0 * fVar144;
    auVar86._20_4_ = fVar145;
    fVar146 = auVar72._24_4_ * 3.0 * fVar144;
    auVar86._24_4_ = fVar146;
    auVar86._28_4_ = fVar144;
    auVar60 = vxorps_avx512vl(auVar242._0_16_,auVar242._0_16_);
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_01fb9fc0,ZEXT1632(auVar60));
    auVar80 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9fc0,ZEXT1632(auVar60));
    auVar71 = ZEXT1632(auVar60);
    auVar81 = vpermt2ps_avx512vl(auVar78,_DAT_01fb9fc0,auVar71);
    auVar82._0_4_ = auVar70._0_4_ + fVar126;
    auVar82._4_4_ = auVar70._4_4_ + fVar140;
    auVar82._8_4_ = auVar70._8_4_ + fVar141;
    auVar82._12_4_ = auVar70._12_4_ + fVar142;
    auVar82._16_4_ = auVar70._16_4_ + fVar143;
    auVar82._20_4_ = auVar70._20_4_ + fVar145;
    auVar82._24_4_ = auVar70._24_4_ + fVar146;
    auVar82._28_4_ = auVar70._28_4_ + fVar144;
    auVar68 = vmaxps_avx(auVar70,auVar82);
    auVar67 = vminps_avx(auVar70,auVar82);
    auVar74 = vpermt2ps_avx512vl(auVar70,_DAT_01fb9fc0,auVar71);
    auVar82 = vpermt2ps_avx512vl(auVar94,_DAT_01fb9fc0,auVar71);
    auVar83 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar71);
    auVar91 = ZEXT1632(auVar60);
    auVar84 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,auVar91);
    auVar70 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar91);
    auVar70 = vsubps_avx(auVar74,auVar70);
    auVar71 = vsubps_avx(auVar79,ZEXT1632(auVar64));
    auVar72 = vsubps_avx(auVar80,auVar77);
    auVar73 = vsubps_avx(auVar81,auVar78);
    auVar75 = vmulps_avx512vl(auVar72,auVar96);
    auVar75 = vfmsub231ps_avx512vl(auVar75,auVar95,auVar73);
    auVar76 = vmulps_avx512vl(auVar73,auVar94);
    auVar76 = vfmsub231ps_avx512vl(auVar76,auVar96,auVar71);
    auVar85 = vmulps_avx512vl(auVar71,auVar95);
    auVar85 = vfmsub231ps_avx512vl(auVar85,auVar94,auVar72);
    auVar85 = vmulps_avx512vl(auVar85,auVar85);
    auVar76 = vfmadd231ps_avx512vl(auVar85,auVar76,auVar76);
    auVar75 = vfmadd231ps_avx512vl(auVar76,auVar75,auVar75);
    auVar76 = vmulps_avx512vl(auVar73,auVar73);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar72,auVar72);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar71,auVar71);
    auVar85 = vrcp14ps_avx512vl(auVar76);
    auVar86 = vfnmadd213ps_avx512vl(auVar85,auVar76,auVar69);
    auVar85 = vfmadd132ps_avx512vl(auVar86,auVar85,auVar85);
    auVar75 = vmulps_avx512vl(auVar75,auVar85);
    auVar86 = vmulps_avx512vl(auVar72,auVar84);
    auVar86 = vfmsub231ps_avx512vl(auVar86,auVar83,auVar73);
    auVar87 = vmulps_avx512vl(auVar73,auVar82);
    auVar87 = vfmsub231ps_avx512vl(auVar87,auVar84,auVar71);
    auVar88 = vmulps_avx512vl(auVar71,auVar83);
    auVar88 = vfmsub231ps_avx512vl(auVar88,auVar82,auVar72);
    auVar88 = vmulps_avx512vl(auVar88,auVar88);
    auVar87 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar87);
    auVar86 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar86);
    auVar85 = vmulps_avx512vl(auVar86,auVar85);
    auVar75 = vmaxps_avx512vl(auVar75,auVar85);
    auVar75 = vsqrtps_avx512vl(auVar75);
    auVar85 = vmaxps_avx512vl(auVar70,auVar74);
    auVar68 = vmaxps_avx512vl(auVar68,auVar85);
    auVar85 = vaddps_avx512vl(auVar75,auVar68);
    auVar68 = vminps_avx(auVar70,auVar74);
    auVar68 = vminps_avx(auVar67,auVar68);
    auVar68 = vsubps_avx512vl(auVar68,auVar75);
    auVar67._8_4_ = 0x3f800002;
    auVar67._0_8_ = 0x3f8000023f800002;
    auVar67._12_4_ = 0x3f800002;
    auVar67._16_4_ = 0x3f800002;
    auVar67._20_4_ = 0x3f800002;
    auVar67._24_4_ = 0x3f800002;
    auVar67._28_4_ = 0x3f800002;
    auVar67 = vmulps_avx512vl(auVar85,auVar67);
    auVar74._8_4_ = 0x3f7ffffc;
    auVar74._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar74._12_4_ = 0x3f7ffffc;
    auVar74._16_4_ = 0x3f7ffffc;
    auVar74._20_4_ = 0x3f7ffffc;
    auVar74._24_4_ = 0x3f7ffffc;
    auVar74._28_4_ = 0x3f7ffffc;
    local_5a0 = vmulps_avx512vl(auVar68,auVar74);
    auVar68 = vmulps_avx512vl(auVar67,auVar67);
    auVar67 = vrsqrt14ps_avx512vl(auVar76);
    auVar75._8_4_ = 0xbf000000;
    auVar75._0_8_ = 0xbf000000bf000000;
    auVar75._12_4_ = 0xbf000000;
    auVar75._16_4_ = 0xbf000000;
    auVar75._20_4_ = 0xbf000000;
    auVar75._24_4_ = 0xbf000000;
    auVar75._28_4_ = 0xbf000000;
    auVar70 = vmulps_avx512vl(auVar76,auVar75);
    fVar126 = auVar67._0_4_;
    fVar140 = auVar67._4_4_;
    fVar141 = auVar67._8_4_;
    fVar142 = auVar67._12_4_;
    fVar144 = auVar67._16_4_;
    fVar143 = auVar67._20_4_;
    fVar145 = auVar67._24_4_;
    auVar87._4_4_ = fVar140 * fVar140 * fVar140 * auVar70._4_4_;
    auVar87._0_4_ = fVar126 * fVar126 * fVar126 * auVar70._0_4_;
    auVar87._8_4_ = fVar141 * fVar141 * fVar141 * auVar70._8_4_;
    auVar87._12_4_ = fVar142 * fVar142 * fVar142 * auVar70._12_4_;
    auVar87._16_4_ = fVar144 * fVar144 * fVar144 * auVar70._16_4_;
    auVar87._20_4_ = fVar143 * fVar143 * fVar143 * auVar70._20_4_;
    auVar87._24_4_ = fVar145 * fVar145 * fVar145 * auVar70._24_4_;
    auVar87._28_4_ = auVar85._28_4_;
    auVar76._8_4_ = 0x3fc00000;
    auVar76._0_8_ = 0x3fc000003fc00000;
    auVar76._12_4_ = 0x3fc00000;
    auVar76._16_4_ = 0x3fc00000;
    auVar76._20_4_ = 0x3fc00000;
    auVar76._24_4_ = 0x3fc00000;
    auVar76._28_4_ = 0x3fc00000;
    auVar67 = vfmadd231ps_avx512vl(auVar87,auVar67,auVar76);
    auVar70 = vmulps_avx512vl(auVar71,auVar67);
    auVar74 = vmulps_avx512vl(auVar72,auVar67);
    auVar75 = vmulps_avx512vl(auVar73,auVar67);
    auVar191 = ZEXT1632(auVar64);
    auVar76 = vsubps_avx512vl(auVar91,auVar191);
    auVar86 = vsubps_avx512vl(auVar91,auVar77);
    auVar87 = vsubps_avx512vl(auVar91,auVar78);
    auVar85 = vmulps_avx512vl(auVar239._0_32_,auVar87);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar237._0_32_,auVar86);
    local_700 = auVar240._0_32_;
    auVar85 = vfmadd231ps_avx512vl(auVar85,local_700,auVar76);
    auVar88 = vmulps_avx512vl(auVar87,auVar87);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar86);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar76,auVar76);
    auVar89 = vmulps_avx512vl(auVar239._0_32_,auVar75);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar74,auVar237._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar70,local_700);
    auVar75 = vmulps_avx512vl(auVar87,auVar75);
    auVar74 = vfmadd231ps_avx512vl(auVar75,auVar86,auVar74);
    auVar70 = vfmadd231ps_avx512vl(auVar74,auVar76,auVar70);
    auVar74 = vmulps_avx512vl(auVar89,auVar89);
    auVar75 = vsubps_avx512vl(local_1e0,auVar74);
    auVar90 = vmulps_avx512vl(auVar89,auVar70);
    auVar85 = vsubps_avx512vl(auVar85,auVar90);
    auVar90 = vaddps_avx512vl(auVar85,auVar85);
    auVar85 = vmulps_avx512vl(auVar70,auVar70);
    local_560 = vsubps_avx512vl(auVar88,auVar85);
    auVar68 = vsubps_avx512vl(local_560,auVar68);
    local_520 = vmulps_avx512vl(auVar90,auVar90);
    auVar85._8_4_ = 0x40800000;
    auVar85._0_8_ = 0x4080000040800000;
    auVar85._12_4_ = 0x40800000;
    auVar85._16_4_ = 0x40800000;
    auVar85._20_4_ = 0x40800000;
    auVar85._24_4_ = 0x40800000;
    auVar85._28_4_ = 0x40800000;
    _local_380 = vmulps_avx512vl(auVar75,auVar85);
    auVar85 = vmulps_avx512vl(_local_380,auVar68);
    auVar85 = vsubps_avx512vl(local_520,auVar85);
    uVar53 = vcmpps_avx512vl(auVar85,auVar91,5);
    bVar43 = (byte)uVar53;
    if (bVar43 == 0) {
LAB_01820db2:
      auVar237 = ZEXT3264(local_6e0);
      auVar239 = ZEXT3264(local_760);
      auVar221 = ZEXT3264(local_5c0);
      auVar223 = ZEXT3264(local_5e0);
      auVar225 = ZEXT3264(local_600);
      auVar217 = ZEXT3264(local_620);
      auVar193 = ZEXT3264(local_4a0);
      auVar209 = ZEXT3264(local_640);
      auVar242 = ZEXT3264(local_780);
      auVar230 = ZEXT3264(local_7a0);
      auVar231 = ZEXT3264(local_7c0);
      auVar232 = ZEXT3264(local_7e0);
      auVar233 = ZEXT3264(local_800);
      auVar234 = ZEXT3264(local_820);
      auVar235 = ZEXT3264(local_840);
      auVar236 = ZEXT3264(local_860);
      auVar238 = ZEXT3264(local_880);
      auVar241 = ZEXT3264(local_720);
    }
    else {
      auVar85 = vsqrtps_avx512vl(auVar85);
      auVar91 = vaddps_avx512vl(auVar75,auVar75);
      local_400 = vrcp14ps_avx512vl(auVar91);
      auVar69 = vfnmadd213ps_avx512vl(local_400,auVar91,auVar69);
      auVar88 = vfmadd132ps_avx512vl(auVar69,local_400,local_400);
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar69._16_4_ = 0x80000000;
      auVar69._20_4_ = 0x80000000;
      auVar69._24_4_ = 0x80000000;
      auVar69._28_4_ = 0x80000000;
      local_540 = vxorps_avx512vl(auVar90,auVar69);
      auVar69 = vsubps_avx512vl(local_540,auVar85);
      local_580 = vmulps_avx512vl(auVar69,auVar88);
      auVar85 = vsubps_avx512vl(auVar85,auVar90);
      local_3a0 = vmulps_avx512vl(auVar85,auVar88);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar85 = vblendmps_avx512vl(auVar85,local_580);
      auVar92._0_4_ = (uint)(bVar43 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar43 & 1) * auVar88._0_4_
      ;
      bVar50 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar92._4_4_ = (uint)bVar50 * auVar85._4_4_ | (uint)!bVar50 * auVar88._4_4_;
      bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar92._8_4_ = (uint)bVar50 * auVar85._8_4_ | (uint)!bVar50 * auVar88._8_4_;
      bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar92._12_4_ = (uint)bVar50 * auVar85._12_4_ | (uint)!bVar50 * auVar88._12_4_;
      bVar50 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar92._16_4_ = (uint)bVar50 * auVar85._16_4_ | (uint)!bVar50 * auVar88._16_4_;
      bVar50 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar92._20_4_ = (uint)bVar50 * auVar85._20_4_ | (uint)!bVar50 * auVar88._20_4_;
      bVar50 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar92._24_4_ = (uint)bVar50 * auVar85._24_4_ | (uint)!bVar50 * auVar88._24_4_;
      bVar50 = SUB81(uVar53 >> 7,0);
      auVar92._28_4_ = (uint)bVar50 * auVar85._28_4_ | (uint)!bVar50 * auVar88._28_4_;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar69 = vblendmps_avx512vl(auVar85,local_3a0);
      auVar93._0_4_ = (uint)(bVar43 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar43 & 1) * auVar85._0_4_
      ;
      bVar50 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar93._4_4_ = (uint)bVar50 * auVar69._4_4_ | (uint)!bVar50 * auVar85._4_4_;
      bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar93._8_4_ = (uint)bVar50 * auVar69._8_4_ | (uint)!bVar50 * auVar85._8_4_;
      bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar93._12_4_ = (uint)bVar50 * auVar69._12_4_ | (uint)!bVar50 * auVar85._12_4_;
      bVar50 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar93._16_4_ = (uint)bVar50 * auVar69._16_4_ | (uint)!bVar50 * auVar85._16_4_;
      bVar50 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar93._20_4_ = (uint)bVar50 * auVar69._20_4_ | (uint)!bVar50 * auVar85._20_4_;
      bVar50 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar93._24_4_ = (uint)bVar50 * auVar69._24_4_ | (uint)!bVar50 * auVar85._24_4_;
      bVar50 = SUB81(uVar53 >> 7,0);
      auVar93._28_4_ = (uint)bVar50 * auVar69._28_4_ | (uint)!bVar50 * auVar85._28_4_;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar74,auVar85);
      local_3c0 = vmaxps_avx512vl(local_200,auVar85);
      auVar88._8_4_ = 0x36000000;
      auVar88._0_8_ = 0x3600000036000000;
      auVar88._12_4_ = 0x36000000;
      auVar88._16_4_ = 0x36000000;
      auVar88._20_4_ = 0x36000000;
      auVar88._24_4_ = 0x36000000;
      auVar88._28_4_ = 0x36000000;
      local_3e0 = vmulps_avx512vl(local_3c0,auVar88);
      vandps_avx512vl(auVar75,auVar85);
      uVar48 = vcmpps_avx512vl(local_3e0,local_3e0,1);
      uVar53 = uVar53 & uVar48;
      bVar46 = (byte)uVar53;
      if (bVar46 != 0) {
        uVar48 = vcmpps_avx512vl(auVar68,_DAT_01f7b000,2);
        auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar75 = vblendmps_avx512vl(auVar68,auVar74);
        bVar47 = (byte)uVar48;
        uVar54 = (uint)(bVar47 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar47 & 1) * local_3e0._0_4_;
        bVar50 = (bool)((byte)(uVar48 >> 1) & 1);
        uVar104 = (uint)bVar50 * auVar75._4_4_ | (uint)!bVar50 * local_3e0._4_4_;
        bVar50 = (bool)((byte)(uVar48 >> 2) & 1);
        uVar105 = (uint)bVar50 * auVar75._8_4_ | (uint)!bVar50 * local_3e0._8_4_;
        bVar50 = (bool)((byte)(uVar48 >> 3) & 1);
        uVar106 = (uint)bVar50 * auVar75._12_4_ | (uint)!bVar50 * local_3e0._12_4_;
        bVar50 = (bool)((byte)(uVar48 >> 4) & 1);
        uVar107 = (uint)bVar50 * auVar75._16_4_ | (uint)!bVar50 * local_3e0._16_4_;
        bVar50 = (bool)((byte)(uVar48 >> 5) & 1);
        uVar108 = (uint)bVar50 * auVar75._20_4_ | (uint)!bVar50 * local_3e0._20_4_;
        bVar50 = (bool)((byte)(uVar48 >> 6) & 1);
        uVar109 = (uint)bVar50 * auVar75._24_4_ | (uint)!bVar50 * local_3e0._24_4_;
        bVar50 = SUB81(uVar48 >> 7,0);
        uVar110 = (uint)bVar50 * auVar75._28_4_ | (uint)!bVar50 * local_3e0._28_4_;
        auVar92._0_4_ = (bVar46 & 1) * uVar54 | !(bool)(bVar46 & 1) * auVar92._0_4_;
        bVar50 = (bool)((byte)(uVar53 >> 1) & 1);
        auVar92._4_4_ = bVar50 * uVar104 | !bVar50 * auVar92._4_4_;
        bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
        auVar92._8_4_ = bVar50 * uVar105 | !bVar50 * auVar92._8_4_;
        bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
        auVar92._12_4_ = bVar50 * uVar106 | !bVar50 * auVar92._12_4_;
        bVar50 = (bool)((byte)(uVar53 >> 4) & 1);
        auVar92._16_4_ = bVar50 * uVar107 | !bVar50 * auVar92._16_4_;
        bVar50 = (bool)((byte)(uVar53 >> 5) & 1);
        auVar92._20_4_ = bVar50 * uVar108 | !bVar50 * auVar92._20_4_;
        bVar50 = (bool)((byte)(uVar53 >> 6) & 1);
        auVar92._24_4_ = bVar50 * uVar109 | !bVar50 * auVar92._24_4_;
        bVar50 = SUB81(uVar53 >> 7,0);
        auVar92._28_4_ = bVar50 * uVar110 | !bVar50 * auVar92._28_4_;
        auVar68 = vblendmps_avx512vl(auVar74,auVar68);
        bVar50 = (bool)((byte)(uVar48 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar48 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar48 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar48 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar48 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar48 >> 6) & 1);
        bVar11 = SUB81(uVar48 >> 7,0);
        auVar93._0_4_ =
             (uint)(bVar46 & 1) *
             ((uint)(bVar47 & 1) * auVar68._0_4_ | !(bool)(bVar47 & 1) * uVar54) |
             !(bool)(bVar46 & 1) * auVar93._0_4_;
        bVar5 = (bool)((byte)(uVar53 >> 1) & 1);
        auVar93._4_4_ =
             (uint)bVar5 * ((uint)bVar50 * auVar68._4_4_ | !bVar50 * uVar104) |
             !bVar5 * auVar93._4_4_;
        bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
        auVar93._8_4_ =
             (uint)bVar50 * ((uint)bVar6 * auVar68._8_4_ | !bVar6 * uVar105) |
             !bVar50 * auVar93._8_4_;
        bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
        auVar93._12_4_ =
             (uint)bVar50 * ((uint)bVar7 * auVar68._12_4_ | !bVar7 * uVar106) |
             !bVar50 * auVar93._12_4_;
        bVar50 = (bool)((byte)(uVar53 >> 4) & 1);
        auVar93._16_4_ =
             (uint)bVar50 * ((uint)bVar8 * auVar68._16_4_ | !bVar8 * uVar107) |
             !bVar50 * auVar93._16_4_;
        bVar50 = (bool)((byte)(uVar53 >> 5) & 1);
        auVar93._20_4_ =
             (uint)bVar50 * ((uint)bVar9 * auVar68._20_4_ | !bVar9 * uVar108) |
             !bVar50 * auVar93._20_4_;
        bVar50 = (bool)((byte)(uVar53 >> 6) & 1);
        auVar93._24_4_ =
             (uint)bVar50 * ((uint)bVar10 * auVar68._24_4_ | !bVar10 * uVar109) |
             !bVar50 * auVar93._24_4_;
        bVar50 = SUB81(uVar53 >> 7,0);
        auVar93._28_4_ =
             (uint)bVar50 * ((uint)bVar11 * auVar68._28_4_ | !bVar11 * uVar110) |
             !bVar50 * auVar93._28_4_;
        bVar43 = (~bVar46 | bVar47) & bVar43;
      }
      if ((bVar43 & 0x7f) == 0) goto LAB_01820db2;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar69 = vxorps_avx512vl(auVar84,auVar85);
      auVar82 = vxorps_avx512vl(auVar82,auVar85);
      auVar84 = vxorps_avx512vl(auVar83,auVar85);
      auVar60 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_500);
      auVar68 = vbroadcastss_avx512vl(auVar60);
      auVar68 = vmaxps_avx512vl(auVar68,auVar92);
      auVar60 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_500);
      auVar74 = vbroadcastss_avx512vl(auVar60);
      auVar74 = vminps_avx512vl(auVar74,auVar93);
      auVar75 = vmulps_avx512vl(auVar87,auVar96);
      auVar75 = vfmadd213ps_avx512vl(auVar86,auVar95,auVar75);
      auVar60 = vfmadd213ps_fma(auVar76,auVar94,auVar75);
      auVar75 = vmulps_avx512vl(local_760,auVar96);
      auVar75 = vfmadd231ps_avx512vl(auVar75,local_6e0,auVar95);
      auVar75 = vfmadd231ps_avx512vl(auVar75,local_700,auVar94);
      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar75,auVar76);
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar76,auVar86,1);
      auVar87 = vxorps_avx512vl(ZEXT1632(auVar60),auVar85);
      auVar88 = vrcp14ps_avx512vl(auVar75);
      auVar94 = vxorps_avx512vl(auVar75,auVar85);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar83 = vfnmadd213ps_avx512vl(auVar88,auVar75,auVar95);
      auVar60 = vfmadd132ps_fma(auVar83,auVar88,auVar88);
      fVar126 = auVar60._0_4_ * auVar87._0_4_;
      fVar140 = auVar60._4_4_ * auVar87._4_4_;
      auVar83._4_4_ = fVar140;
      auVar83._0_4_ = fVar126;
      fVar141 = auVar60._8_4_ * auVar87._8_4_;
      auVar83._8_4_ = fVar141;
      fVar142 = auVar60._12_4_ * auVar87._12_4_;
      auVar83._12_4_ = fVar142;
      fVar144 = auVar87._16_4_ * 0.0;
      auVar83._16_4_ = fVar144;
      fVar143 = auVar87._20_4_ * 0.0;
      auVar83._20_4_ = fVar143;
      fVar145 = auVar87._24_4_ * 0.0;
      auVar83._24_4_ = fVar145;
      auVar83._28_4_ = auVar87._28_4_;
      uVar16 = vcmpps_avx512vl(auVar75,auVar94,1);
      bVar46 = (byte)uVar14 | (byte)uVar16;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar83 = vblendmps_avx512vl(auVar83,auVar96);
      auVar97._0_4_ = (uint)(bVar46 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar46 & 1) * auVar88._0_4_
      ;
      bVar50 = (bool)(bVar46 >> 1 & 1);
      auVar97._4_4_ = (uint)bVar50 * auVar83._4_4_ | (uint)!bVar50 * auVar88._4_4_;
      bVar50 = (bool)(bVar46 >> 2 & 1);
      auVar97._8_4_ = (uint)bVar50 * auVar83._8_4_ | (uint)!bVar50 * auVar88._8_4_;
      bVar50 = (bool)(bVar46 >> 3 & 1);
      auVar97._12_4_ = (uint)bVar50 * auVar83._12_4_ | (uint)!bVar50 * auVar88._12_4_;
      bVar50 = (bool)(bVar46 >> 4 & 1);
      auVar97._16_4_ = (uint)bVar50 * auVar83._16_4_ | (uint)!bVar50 * auVar88._16_4_;
      bVar50 = (bool)(bVar46 >> 5 & 1);
      auVar97._20_4_ = (uint)bVar50 * auVar83._20_4_ | (uint)!bVar50 * auVar88._20_4_;
      bVar50 = (bool)(bVar46 >> 6 & 1);
      auVar97._24_4_ = (uint)bVar50 * auVar83._24_4_ | (uint)!bVar50 * auVar88._24_4_;
      auVar97._28_4_ =
           (uint)(bVar46 >> 7) * auVar83._28_4_ | (uint)!(bool)(bVar46 >> 7) * auVar88._28_4_;
      auVar83 = vmaxps_avx512vl(auVar68,auVar97);
      uVar16 = vcmpps_avx512vl(auVar75,auVar94,6);
      bVar46 = (byte)uVar14 | (byte)uVar16;
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar98._0_4_ = (uint)(bVar46 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar46 & 1) * (int)fVar126;
      bVar50 = (bool)(bVar46 >> 1 & 1);
      auVar98._4_4_ = (uint)bVar50 * auVar88._4_4_ | (uint)!bVar50 * (int)fVar140;
      bVar50 = (bool)(bVar46 >> 2 & 1);
      auVar98._8_4_ = (uint)bVar50 * auVar88._8_4_ | (uint)!bVar50 * (int)fVar141;
      bVar50 = (bool)(bVar46 >> 3 & 1);
      auVar98._12_4_ = (uint)bVar50 * auVar88._12_4_ | (uint)!bVar50 * (int)fVar142;
      bVar50 = (bool)(bVar46 >> 4 & 1);
      auVar98._16_4_ = (uint)bVar50 * auVar88._16_4_ | (uint)!bVar50 * (int)fVar144;
      bVar50 = (bool)(bVar46 >> 5 & 1);
      auVar98._20_4_ = (uint)bVar50 * auVar88._20_4_ | (uint)!bVar50 * (int)fVar143;
      bVar50 = (bool)(bVar46 >> 6 & 1);
      auVar98._24_4_ = (uint)bVar50 * auVar88._24_4_ | (uint)!bVar50 * (int)fVar145;
      auVar98._28_4_ =
           (uint)(bVar46 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar46 >> 7) * auVar87._28_4_;
      auVar87 = vminps_avx512vl(auVar74,auVar98);
      auVar68 = vsubps_avx(ZEXT832(0) << 0x20,auVar79);
      auVar74 = vsubps_avx(ZEXT832(0) << 0x20,auVar80);
      auVar79 = ZEXT832(0) << 0x20;
      auVar75 = vsubps_avx(auVar79,auVar81);
      auVar75 = vmulps_avx512vl(auVar75,auVar69);
      auVar74 = vfmadd231ps_avx512vl(auVar75,auVar84,auVar74);
      auVar68 = vfmadd231ps_avx512vl(auVar74,auVar82,auVar68);
      auVar74 = vmulps_avx512vl(local_760,auVar69);
      auVar237 = ZEXT3264(local_6e0);
      auVar74 = vfmadd231ps_avx512vl(auVar74,local_6e0,auVar84);
      auVar74 = vfmadd231ps_avx512vl(auVar74,local_700,auVar82);
      vandps_avx512vl(auVar74,auVar76);
      uVar14 = vcmpps_avx512vl(auVar74,auVar86,1);
      auVar68 = vxorps_avx512vl(auVar68,auVar85);
      auVar75 = vrcp14ps_avx512vl(auVar74);
      auVar76 = vxorps_avx512vl(auVar74,auVar85);
      auVar85 = vfnmadd213ps_avx512vl(auVar75,auVar74,auVar95);
      auVar60 = vfmadd132ps_fma(auVar85,auVar75,auVar75);
      fVar126 = auVar60._0_4_ * auVar68._0_4_;
      fVar140 = auVar60._4_4_ * auVar68._4_4_;
      auVar84._4_4_ = fVar140;
      auVar84._0_4_ = fVar126;
      fVar141 = auVar60._8_4_ * auVar68._8_4_;
      auVar84._8_4_ = fVar141;
      fVar142 = auVar60._12_4_ * auVar68._12_4_;
      auVar84._12_4_ = fVar142;
      fVar144 = auVar68._16_4_ * 0.0;
      auVar84._16_4_ = fVar144;
      fVar143 = auVar68._20_4_ * 0.0;
      auVar84._20_4_ = fVar143;
      fVar145 = auVar68._24_4_ * 0.0;
      auVar84._24_4_ = fVar145;
      auVar84._28_4_ = auVar68._28_4_;
      uVar16 = vcmpps_avx512vl(auVar74,auVar76,1);
      bVar46 = (byte)uVar14 | (byte)uVar16;
      auVar85 = vblendmps_avx512vl(auVar84,auVar96);
      auVar99._0_4_ = (uint)(bVar46 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar46 & 1) * auVar75._0_4_
      ;
      bVar50 = (bool)(bVar46 >> 1 & 1);
      auVar99._4_4_ = (uint)bVar50 * auVar85._4_4_ | (uint)!bVar50 * auVar75._4_4_;
      bVar50 = (bool)(bVar46 >> 2 & 1);
      auVar99._8_4_ = (uint)bVar50 * auVar85._8_4_ | (uint)!bVar50 * auVar75._8_4_;
      bVar50 = (bool)(bVar46 >> 3 & 1);
      auVar99._12_4_ = (uint)bVar50 * auVar85._12_4_ | (uint)!bVar50 * auVar75._12_4_;
      bVar50 = (bool)(bVar46 >> 4 & 1);
      auVar99._16_4_ = (uint)bVar50 * auVar85._16_4_ | (uint)!bVar50 * auVar75._16_4_;
      bVar50 = (bool)(bVar46 >> 5 & 1);
      auVar99._20_4_ = (uint)bVar50 * auVar85._20_4_ | (uint)!bVar50 * auVar75._20_4_;
      bVar50 = (bool)(bVar46 >> 6 & 1);
      auVar99._24_4_ = (uint)bVar50 * auVar85._24_4_ | (uint)!bVar50 * auVar75._24_4_;
      auVar99._28_4_ =
           (uint)(bVar46 >> 7) * auVar85._28_4_ | (uint)!(bool)(bVar46 >> 7) * auVar75._28_4_;
      local_300 = vmaxps_avx512vl(auVar83,auVar99);
      uVar16 = vcmpps_avx512vl(auVar74,auVar76,6);
      bVar46 = (byte)uVar14 | (byte)uVar16;
      auVar100._0_4_ = (uint)(bVar46 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar46 & 1) * (int)fVar126
      ;
      bVar50 = (bool)(bVar46 >> 1 & 1);
      auVar100._4_4_ = (uint)bVar50 * auVar88._4_4_ | (uint)!bVar50 * (int)fVar140;
      bVar50 = (bool)(bVar46 >> 2 & 1);
      auVar100._8_4_ = (uint)bVar50 * auVar88._8_4_ | (uint)!bVar50 * (int)fVar141;
      bVar50 = (bool)(bVar46 >> 3 & 1);
      auVar100._12_4_ = (uint)bVar50 * auVar88._12_4_ | (uint)!bVar50 * (int)fVar142;
      bVar50 = (bool)(bVar46 >> 4 & 1);
      auVar100._16_4_ = (uint)bVar50 * auVar88._16_4_ | (uint)!bVar50 * (int)fVar144;
      bVar50 = (bool)(bVar46 >> 5 & 1);
      auVar100._20_4_ = (uint)bVar50 * auVar88._20_4_ | (uint)!bVar50 * (int)fVar143;
      bVar50 = (bool)(bVar46 >> 6 & 1);
      auVar100._24_4_ = (uint)bVar50 * auVar88._24_4_ | (uint)!bVar50 * (int)fVar145;
      auVar100._28_4_ =
           (uint)(bVar46 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar46 >> 7) * auVar68._28_4_;
      local_280 = vminps_avx(auVar87,auVar100);
      uVar14 = vcmpps_avx512vl(local_300,local_280,2);
      bVar43 = bVar43 & 0x7f & (byte)uVar14;
      if (bVar43 == 0) {
        auVar240 = ZEXT3264(local_700);
        goto LAB_01820db2;
      }
      auVar68 = vmaxps_avx(auVar79,local_5a0);
      auVar74 = vfmadd213ps_avx512vl(local_580,auVar89,auVar70);
      fVar126 = auVar67._0_4_;
      fVar140 = auVar67._4_4_;
      auVar35._4_4_ = fVar140 * auVar74._4_4_;
      auVar35._0_4_ = fVar126 * auVar74._0_4_;
      fVar141 = auVar67._8_4_;
      auVar35._8_4_ = fVar141 * auVar74._8_4_;
      fVar142 = auVar67._12_4_;
      auVar35._12_4_ = fVar142 * auVar74._12_4_;
      fVar144 = auVar67._16_4_;
      auVar35._16_4_ = fVar144 * auVar74._16_4_;
      fVar143 = auVar67._20_4_;
      auVar35._20_4_ = fVar143 * auVar74._20_4_;
      fVar145 = auVar67._24_4_;
      auVar35._24_4_ = fVar145 * auVar74._24_4_;
      auVar35._28_4_ = auVar74._28_4_;
      auVar74 = vfmadd213ps_avx512vl(local_3a0,auVar89,auVar70);
      auVar36._4_4_ = fVar140 * auVar74._4_4_;
      auVar36._0_4_ = fVar126 * auVar74._0_4_;
      auVar36._8_4_ = fVar141 * auVar74._8_4_;
      auVar36._12_4_ = fVar142 * auVar74._12_4_;
      auVar36._16_4_ = fVar144 * auVar74._16_4_;
      auVar36._20_4_ = fVar143 * auVar74._20_4_;
      auVar36._24_4_ = fVar145 * auVar74._24_4_;
      auVar36._28_4_ = auVar74._28_4_;
      auVar74 = vminps_avx512vl(auVar35,auVar95);
      auVar75 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar74 = vmaxps_avx(auVar74,ZEXT832(0) << 0x20);
      auVar76 = vminps_avx512vl(auVar36,auVar95);
      auVar37._4_4_ = (auVar74._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar74._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar74._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar74._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar74._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar74._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar74._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar74._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar37,local_8c0,_local_8a0);
      auVar74 = vmaxps_avx(auVar76,ZEXT832(0) << 0x20);
      auVar38._4_4_ = (auVar74._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar74._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar74._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar74._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar74._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar74._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar74._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar74._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar38,local_8c0,_local_8a0);
      auVar39._4_4_ = auVar68._4_4_ * auVar68._4_4_;
      auVar39._0_4_ = auVar68._0_4_ * auVar68._0_4_;
      auVar39._8_4_ = auVar68._8_4_ * auVar68._8_4_;
      auVar39._12_4_ = auVar68._12_4_ * auVar68._12_4_;
      auVar39._16_4_ = auVar68._16_4_ * auVar68._16_4_;
      auVar39._20_4_ = auVar68._20_4_ * auVar68._20_4_;
      auVar39._24_4_ = auVar68._24_4_ * auVar68._24_4_;
      auVar39._28_4_ = auVar68._28_4_;
      auVar74 = vsubps_avx(local_560,auVar39);
      auVar40._4_4_ = auVar74._4_4_ * (float)local_380._4_4_;
      auVar40._0_4_ = auVar74._0_4_ * (float)local_380._0_4_;
      auVar40._8_4_ = auVar74._8_4_ * fStack_378;
      auVar40._12_4_ = auVar74._12_4_ * fStack_374;
      auVar40._16_4_ = auVar74._16_4_ * fStack_370;
      auVar40._20_4_ = auVar74._20_4_ * fStack_36c;
      auVar40._24_4_ = auVar74._24_4_ * fStack_368;
      auVar40._28_4_ = auVar68._28_4_;
      auVar68 = vsubps_avx(local_520,auVar40);
      uVar14 = vcmpps_avx512vl(auVar68,ZEXT832(0) << 0x20,5);
      bVar46 = (byte)uVar14;
      auVar241 = ZEXT3264(local_720);
      if (bVar46 == 0) {
        bVar46 = 0;
        auVar68 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar193 = ZEXT864(0) << 0x20;
        auVar76 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar85 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar220 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar89._8_4_ = 0x7f800000;
        auVar89._0_8_ = 0x7f8000007f800000;
        auVar89._12_4_ = 0x7f800000;
        auVar89._16_4_ = 0x7f800000;
        auVar89._20_4_ = 0x7f800000;
        auVar89._24_4_ = 0x7f800000;
        auVar89._28_4_ = 0x7f800000;
        auVar90._8_4_ = 0xff800000;
        auVar90._0_8_ = 0xff800000ff800000;
        auVar90._12_4_ = 0xff800000;
        auVar90._16_4_ = 0xff800000;
        auVar90._20_4_ = 0xff800000;
        auVar90._24_4_ = 0xff800000;
        auVar90._28_4_ = 0xff800000;
      }
      else {
        auVar58 = vxorps_avx512vl(auVar199,auVar199);
        uVar53 = vcmpps_avx512vl(auVar68,auVar79,5);
        auVar68 = vsqrtps_avx(auVar68);
        auVar75 = vfnmadd213ps_avx512vl(auVar91,local_400,auVar95);
        auVar85 = vfmadd132ps_avx512vl(auVar75,local_400,local_400);
        auVar75 = vsubps_avx(local_540,auVar68);
        auVar79 = vmulps_avx512vl(auVar75,auVar85);
        auVar68 = vsubps_avx512vl(auVar68,auVar90);
        auVar86 = vmulps_avx512vl(auVar68,auVar85);
        auVar68 = vfmadd213ps_avx512vl(auVar89,auVar79,auVar70);
        auVar91._4_4_ = fVar140 * auVar68._4_4_;
        auVar91._0_4_ = fVar126 * auVar68._0_4_;
        auVar91._8_4_ = fVar141 * auVar68._8_4_;
        auVar91._12_4_ = fVar142 * auVar68._12_4_;
        auVar91._16_4_ = fVar144 * auVar68._16_4_;
        auVar91._20_4_ = fVar143 * auVar68._20_4_;
        auVar91._24_4_ = fVar145 * auVar68._24_4_;
        auVar91._28_4_ = auVar76._28_4_;
        auVar68 = vmulps_avx512vl(local_700,auVar79);
        auVar75 = vmulps_avx512vl(local_6e0,auVar79);
        auVar87 = vmulps_avx512vl(local_760,auVar79);
        auVar76 = vfmadd213ps_avx512vl(auVar71,auVar91,auVar191);
        auVar76 = vsubps_avx512vl(auVar68,auVar76);
        auVar68 = vfmadd213ps_avx512vl(auVar72,auVar91,auVar77);
        auVar85 = vsubps_avx512vl(auVar75,auVar68);
        auVar60 = vfmadd213ps_fma(auVar91,auVar73,auVar78);
        auVar68 = vsubps_avx(auVar87,ZEXT1632(auVar60));
        auVar220 = auVar68._0_28_;
        auVar68 = vfmadd213ps_avx512vl(auVar89,auVar86,auVar70);
        auVar41._4_4_ = fVar140 * auVar68._4_4_;
        auVar41._0_4_ = fVar126 * auVar68._0_4_;
        auVar41._8_4_ = fVar141 * auVar68._8_4_;
        auVar41._12_4_ = fVar142 * auVar68._12_4_;
        auVar41._16_4_ = fVar144 * auVar68._16_4_;
        auVar41._20_4_ = fVar143 * auVar68._20_4_;
        auVar41._24_4_ = fVar145 * auVar68._24_4_;
        auVar41._28_4_ = auVar67._28_4_;
        auVar68 = vmulps_avx512vl(local_700,auVar86);
        auVar67 = vmulps_avx512vl(local_6e0,auVar86);
        auVar70 = vmulps_avx512vl(local_760,auVar86);
        auVar60 = vfmadd213ps_fma(auVar71,auVar41,auVar191);
        auVar75 = vsubps_avx(auVar68,ZEXT1632(auVar60));
        auVar60 = vfmadd213ps_fma(auVar72,auVar41,auVar77);
        auVar68 = vsubps_avx(auVar67,ZEXT1632(auVar60));
        auVar60 = vfmadd213ps_fma(auVar73,auVar41,auVar78);
        auVar67 = vsubps_avx512vl(auVar70,ZEXT1632(auVar60));
        auVar193 = ZEXT3264(auVar67);
        auVar164._8_4_ = 0x7f800000;
        auVar164._0_8_ = 0x7f8000007f800000;
        auVar164._12_4_ = 0x7f800000;
        auVar164._16_4_ = 0x7f800000;
        auVar164._20_4_ = 0x7f800000;
        auVar164._24_4_ = 0x7f800000;
        auVar164._28_4_ = 0x7f800000;
        auVar67 = vblendmps_avx512vl(auVar164,auVar79);
        bVar50 = (bool)((byte)uVar53 & 1);
        auVar89._0_4_ = (uint)bVar50 * auVar67._0_4_ | (uint)!bVar50 * 0x7f800000;
        bVar50 = (bool)((byte)(uVar53 >> 1) & 1);
        auVar89._4_4_ = (uint)bVar50 * auVar67._4_4_ | (uint)!bVar50 * 0x7f800000;
        bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
        auVar89._8_4_ = (uint)bVar50 * auVar67._8_4_ | (uint)!bVar50 * 0x7f800000;
        bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
        auVar89._12_4_ = (uint)bVar50 * auVar67._12_4_ | (uint)!bVar50 * 0x7f800000;
        bVar50 = (bool)((byte)(uVar53 >> 4) & 1);
        auVar89._16_4_ = (uint)bVar50 * auVar67._16_4_ | (uint)!bVar50 * 0x7f800000;
        bVar50 = (bool)((byte)(uVar53 >> 5) & 1);
        auVar89._20_4_ = (uint)bVar50 * auVar67._20_4_ | (uint)!bVar50 * 0x7f800000;
        bVar50 = (bool)((byte)(uVar53 >> 6) & 1);
        auVar89._24_4_ = (uint)bVar50 * auVar67._24_4_ | (uint)!bVar50 * 0x7f800000;
        bVar50 = SUB81(uVar53 >> 7,0);
        auVar89._28_4_ = (uint)bVar50 * auVar67._28_4_ | (uint)!bVar50 * 0x7f800000;
        auVar192._8_4_ = 0xff800000;
        auVar192._0_8_ = 0xff800000ff800000;
        auVar192._12_4_ = 0xff800000;
        auVar192._16_4_ = 0xff800000;
        auVar192._20_4_ = 0xff800000;
        auVar192._24_4_ = 0xff800000;
        auVar192._28_4_ = 0xff800000;
        auVar67 = vblendmps_avx512vl(auVar192,auVar86);
        bVar50 = (bool)((byte)uVar53 & 1);
        auVar90._0_4_ = (uint)bVar50 * auVar67._0_4_ | (uint)!bVar50 * -0x800000;
        bVar50 = (bool)((byte)(uVar53 >> 1) & 1);
        auVar90._4_4_ = (uint)bVar50 * auVar67._4_4_ | (uint)!bVar50 * -0x800000;
        bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
        auVar90._8_4_ = (uint)bVar50 * auVar67._8_4_ | (uint)!bVar50 * -0x800000;
        bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
        auVar90._12_4_ = (uint)bVar50 * auVar67._12_4_ | (uint)!bVar50 * -0x800000;
        bVar50 = (bool)((byte)(uVar53 >> 4) & 1);
        auVar90._16_4_ = (uint)bVar50 * auVar67._16_4_ | (uint)!bVar50 * -0x800000;
        bVar50 = (bool)((byte)(uVar53 >> 5) & 1);
        auVar90._20_4_ = (uint)bVar50 * auVar67._20_4_ | (uint)!bVar50 * -0x800000;
        bVar50 = (bool)((byte)(uVar53 >> 6) & 1);
        auVar90._24_4_ = (uint)bVar50 * auVar67._24_4_ | (uint)!bVar50 * -0x800000;
        bVar50 = SUB81(uVar53 >> 7,0);
        auVar90._28_4_ = (uint)bVar50 * auVar67._28_4_ | (uint)!bVar50 * -0x800000;
        auVar191._8_4_ = 0x36000000;
        auVar191._0_8_ = 0x3600000036000000;
        auVar191._12_4_ = 0x36000000;
        auVar191._16_4_ = 0x36000000;
        auVar191._20_4_ = 0x36000000;
        auVar191._24_4_ = 0x36000000;
        auVar191._28_4_ = 0x36000000;
        auVar67 = vmulps_avx512vl(local_3c0,auVar191);
        uVar48 = vcmpps_avx512vl(auVar67,local_3e0,0xe);
        uVar53 = uVar53 & uVar48;
        bVar47 = (byte)uVar53;
        if (bVar47 != 0) {
          uVar48 = vcmpps_avx512vl(auVar74,ZEXT1632(auVar58),2);
          auVar215._8_4_ = 0x7f800000;
          auVar215._0_8_ = 0x7f8000007f800000;
          auVar215._12_4_ = 0x7f800000;
          auVar215._16_4_ = 0x7f800000;
          auVar215._20_4_ = 0x7f800000;
          auVar215._24_4_ = 0x7f800000;
          auVar215._28_4_ = 0x7f800000;
          auVar224._8_4_ = 0xff800000;
          auVar224._0_8_ = 0xff800000ff800000;
          auVar224._12_4_ = 0xff800000;
          auVar224._16_4_ = 0xff800000;
          auVar224._20_4_ = 0xff800000;
          auVar224._24_4_ = 0xff800000;
          auVar224._28_4_ = 0xff800000;
          auVar70 = vblendmps_avx512vl(auVar215,auVar224);
          bVar44 = (byte)uVar48;
          uVar54 = (uint)(bVar44 & 1) * auVar70._0_4_ | (uint)!(bool)(bVar44 & 1) * auVar67._0_4_;
          bVar50 = (bool)((byte)(uVar48 >> 1) & 1);
          uVar104 = (uint)bVar50 * auVar70._4_4_ | (uint)!bVar50 * auVar67._4_4_;
          bVar50 = (bool)((byte)(uVar48 >> 2) & 1);
          uVar105 = (uint)bVar50 * auVar70._8_4_ | (uint)!bVar50 * auVar67._8_4_;
          bVar50 = (bool)((byte)(uVar48 >> 3) & 1);
          uVar106 = (uint)bVar50 * auVar70._12_4_ | (uint)!bVar50 * auVar67._12_4_;
          bVar50 = (bool)((byte)(uVar48 >> 4) & 1);
          uVar107 = (uint)bVar50 * auVar70._16_4_ | (uint)!bVar50 * auVar67._16_4_;
          bVar50 = (bool)((byte)(uVar48 >> 5) & 1);
          uVar108 = (uint)bVar50 * auVar70._20_4_ | (uint)!bVar50 * auVar67._20_4_;
          bVar50 = (bool)((byte)(uVar48 >> 6) & 1);
          uVar109 = (uint)bVar50 * auVar70._24_4_ | (uint)!bVar50 * auVar67._24_4_;
          bVar50 = SUB81(uVar48 >> 7,0);
          uVar110 = (uint)bVar50 * auVar70._28_4_ | (uint)!bVar50 * auVar67._28_4_;
          auVar89._0_4_ = (bVar47 & 1) * uVar54 | !(bool)(bVar47 & 1) * auVar89._0_4_;
          bVar50 = (bool)((byte)(uVar53 >> 1) & 1);
          auVar89._4_4_ = bVar50 * uVar104 | !bVar50 * auVar89._4_4_;
          bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
          auVar89._8_4_ = bVar50 * uVar105 | !bVar50 * auVar89._8_4_;
          bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
          auVar89._12_4_ = bVar50 * uVar106 | !bVar50 * auVar89._12_4_;
          bVar50 = (bool)((byte)(uVar53 >> 4) & 1);
          auVar89._16_4_ = bVar50 * uVar107 | !bVar50 * auVar89._16_4_;
          bVar50 = (bool)((byte)(uVar53 >> 5) & 1);
          auVar89._20_4_ = bVar50 * uVar108 | !bVar50 * auVar89._20_4_;
          bVar50 = (bool)((byte)(uVar53 >> 6) & 1);
          auVar89._24_4_ = bVar50 * uVar109 | !bVar50 * auVar89._24_4_;
          bVar50 = SUB81(uVar53 >> 7,0);
          auVar89._28_4_ = bVar50 * uVar110 | !bVar50 * auVar89._28_4_;
          auVar67 = vblendmps_avx512vl(auVar224,auVar215);
          bVar50 = (bool)((byte)(uVar48 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar48 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar48 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar48 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar48 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar48 >> 6) & 1);
          bVar11 = SUB81(uVar48 >> 7,0);
          auVar90._0_4_ =
               (uint)(bVar47 & 1) *
               ((uint)(bVar44 & 1) * auVar67._0_4_ | !(bool)(bVar44 & 1) * uVar54) |
               !(bool)(bVar47 & 1) * auVar90._0_4_;
          bVar5 = (bool)((byte)(uVar53 >> 1) & 1);
          auVar90._4_4_ =
               (uint)bVar5 * ((uint)bVar50 * auVar67._4_4_ | !bVar50 * uVar104) |
               !bVar5 * auVar90._4_4_;
          bVar50 = (bool)((byte)(uVar53 >> 2) & 1);
          auVar90._8_4_ =
               (uint)bVar50 * ((uint)bVar6 * auVar67._8_4_ | !bVar6 * uVar105) |
               !bVar50 * auVar90._8_4_;
          bVar50 = (bool)((byte)(uVar53 >> 3) & 1);
          auVar90._12_4_ =
               (uint)bVar50 * ((uint)bVar7 * auVar67._12_4_ | !bVar7 * uVar106) |
               !bVar50 * auVar90._12_4_;
          bVar50 = (bool)((byte)(uVar53 >> 4) & 1);
          auVar90._16_4_ =
               (uint)bVar50 * ((uint)bVar8 * auVar67._16_4_ | !bVar8 * uVar107) |
               !bVar50 * auVar90._16_4_;
          bVar50 = (bool)((byte)(uVar53 >> 5) & 1);
          auVar90._20_4_ =
               (uint)bVar50 * ((uint)bVar9 * auVar67._20_4_ | !bVar9 * uVar108) |
               !bVar50 * auVar90._20_4_;
          bVar50 = (bool)((byte)(uVar53 >> 6) & 1);
          auVar90._24_4_ =
               (uint)bVar50 * ((uint)bVar10 * auVar67._24_4_ | !bVar10 * uVar109) |
               !bVar50 * auVar90._24_4_;
          bVar50 = SUB81(uVar53 >> 7,0);
          auVar90._28_4_ =
               (uint)bVar50 * ((uint)bVar11 * auVar67._28_4_ | !bVar11 * uVar110) |
               !bVar50 * auVar90._28_4_;
          bVar46 = (~bVar47 | bVar44) & bVar46;
        }
      }
      auVar240 = ZEXT3264(local_700);
      auVar239 = ZEXT3264(local_760);
      auVar242 = ZEXT3264(local_780);
      auVar230 = ZEXT3264(local_7a0);
      auVar231 = ZEXT3264(local_7c0);
      auVar232 = ZEXT3264(local_7e0);
      auVar233 = ZEXT3264(local_800);
      auVar234 = ZEXT3264(local_820);
      auVar235 = ZEXT3264(local_840);
      auVar236 = ZEXT3264(local_860);
      auVar238 = ZEXT3264(local_880);
      uVar111 = *(undefined4 *)&(ray->dir).field_0;
      auVar208._4_4_ = uVar111;
      auVar208._0_4_ = uVar111;
      auVar208._8_4_ = uVar111;
      auVar208._12_4_ = uVar111;
      auVar208._16_4_ = uVar111;
      auVar208._20_4_ = uVar111;
      auVar208._24_4_ = uVar111;
      auVar208._28_4_ = uVar111;
      uVar111 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar216._4_4_ = uVar111;
      auVar216._0_4_ = uVar111;
      auVar216._8_4_ = uVar111;
      auVar216._12_4_ = uVar111;
      auVar216._16_4_ = uVar111;
      auVar216._20_4_ = uVar111;
      auVar216._24_4_ = uVar111;
      auVar216._28_4_ = uVar111;
      fVar126 = (ray->dir).field_0.m128[2];
      auVar209._0_4_ = fVar126 * auVar193._0_4_;
      auVar209._4_4_ = fVar126 * auVar193._4_4_;
      auVar209._8_4_ = fVar126 * auVar193._8_4_;
      auVar209._12_4_ = fVar126 * auVar193._12_4_;
      auVar209._16_4_ = fVar126 * auVar193._16_4_;
      auVar209._20_4_ = fVar126 * auVar193._20_4_;
      auVar209._28_36_ = auVar193._28_36_;
      auVar209._24_4_ = fVar126 * auVar193._24_4_;
      auVar60 = vfmadd231ps_fma(auVar209._0_32_,auVar216,auVar68);
      auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar208,auVar75);
      auVar222._8_4_ = 0x7fffffff;
      auVar222._0_8_ = 0x7fffffff7fffffff;
      auVar222._12_4_ = 0x7fffffff;
      auVar222._16_4_ = 0x7fffffff;
      auVar222._20_4_ = 0x7fffffff;
      auVar222._24_4_ = 0x7fffffff;
      auVar222._28_4_ = 0x7fffffff;
      auVar68 = vandps_avx(auVar222,ZEXT1632(auVar60));
      _local_260 = local_300;
      auVar204._8_4_ = 0x3e99999a;
      auVar204._0_8_ = 0x3e99999a3e99999a;
      auVar204._12_4_ = 0x3e99999a;
      auVar204._16_4_ = 0x3e99999a;
      auVar204._20_4_ = 0x3e99999a;
      auVar204._24_4_ = 0x3e99999a;
      auVar204._28_4_ = 0x3e99999a;
      uVar14 = vcmpps_avx512vl(auVar68,auVar204,1);
      _local_340 = vmaxps_avx512vl(local_300,auVar90);
      auVar68 = vminps_avx(local_280,auVar89);
      uVar16 = vcmpps_avx512vl(local_300,auVar68,2);
      bVar47 = (byte)uVar16 & bVar43;
      uVar15 = vcmpps_avx512vl(_local_340,local_280,2);
      if ((bVar43 & ((byte)uVar15 | (byte)uVar16)) == 0) {
        auVar221 = ZEXT3264(local_5c0);
        auVar223 = ZEXT3264(local_5e0);
        auVar225 = ZEXT3264(local_600);
        auVar217 = ZEXT3264(local_620);
        auVar193 = ZEXT3264(local_4a0);
        auVar209 = ZEXT3264(local_640);
      }
      else {
        local_728 = (uint)(byte)((byte)uVar14 | ~bVar46);
        auVar42._4_4_ = auVar220._4_4_ * fVar126;
        auVar42._0_4_ = auVar220._0_4_ * fVar126;
        auVar42._8_4_ = auVar220._8_4_ * fVar126;
        auVar42._12_4_ = auVar220._12_4_ * fVar126;
        auVar42._16_4_ = auVar220._16_4_ * fVar126;
        auVar42._20_4_ = auVar220._20_4_ * fVar126;
        auVar42._24_4_ = auVar220._24_4_ * fVar126;
        auVar42._28_4_ = auVar68._28_4_;
        auVar60 = vfmadd213ps_fma(auVar85,auVar216,auVar42);
        auVar60 = vfmadd213ps_fma(auVar76,auVar208,ZEXT1632(auVar60));
        auVar68 = vandps_avx(auVar222,ZEXT1632(auVar60));
        uVar14 = vcmpps_avx512vl(auVar68,auVar204,1);
        bVar46 = (byte)uVar14 | ~bVar46;
        auVar123._8_4_ = 2;
        auVar123._0_8_ = 0x200000002;
        auVar123._12_4_ = 2;
        auVar123._16_4_ = 2;
        auVar123._20_4_ = 2;
        auVar123._24_4_ = 2;
        auVar123._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar68 = vpblendmd_avx512vl(auVar123,auVar30);
        local_220._0_4_ = (uint)(bVar46 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar46 & 1) * 2;
        bVar50 = (bool)(bVar46 >> 1 & 1);
        local_220._4_4_ = (uint)bVar50 * auVar68._4_4_ | (uint)!bVar50 * 2;
        bVar50 = (bool)(bVar46 >> 2 & 1);
        local_220._8_4_ = (uint)bVar50 * auVar68._8_4_ | (uint)!bVar50 * 2;
        bVar50 = (bool)(bVar46 >> 3 & 1);
        local_220._12_4_ = (uint)bVar50 * auVar68._12_4_ | (uint)!bVar50 * 2;
        bVar50 = (bool)(bVar46 >> 4 & 1);
        local_220._16_4_ = (uint)bVar50 * auVar68._16_4_ | (uint)!bVar50 * 2;
        bVar50 = (bool)(bVar46 >> 5 & 1);
        local_220._20_4_ = (uint)bVar50 * auVar68._20_4_ | (uint)!bVar50 * 2;
        bVar50 = (bool)(bVar46 >> 6 & 1);
        local_220._24_4_ = (uint)bVar50 * auVar68._24_4_ | (uint)!bVar50 * 2;
        local_220._28_4_ = (uint)(bVar46 >> 7) * auVar68._28_4_ | (uint)!(bool)(bVar46 >> 7) * 2;
        local_2c0 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpd_avx512vl(local_2c0,local_220,5);
        local_724 = (uint)bVar47;
        bVar47 = (byte)uVar14 & bVar47;
        _local_320 = vaddps_avx512vl(local_300,_local_360);
        _local_2a0 = _local_340;
        for (; auVar68 = _local_8a0, bVar47 != 0; bVar47 = ~bVar46 & bVar47 & (byte)uVar14) {
          auVar124._8_4_ = 0x7f800000;
          auVar124._0_8_ = 0x7f8000007f800000;
          auVar124._12_4_ = 0x7f800000;
          auVar124._16_4_ = 0x7f800000;
          auVar124._20_4_ = 0x7f800000;
          auVar124._24_4_ = 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar67 = vblendmps_avx512vl(auVar124,local_300);
          auVar102._0_4_ =
               (uint)(bVar47 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar47 & 1) * 0x7f800000;
          bVar50 = (bool)(bVar47 >> 1 & 1);
          auVar102._4_4_ = (uint)bVar50 * auVar67._4_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar47 >> 2 & 1);
          auVar102._8_4_ = (uint)bVar50 * auVar67._8_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar47 >> 3 & 1);
          auVar102._12_4_ = (uint)bVar50 * auVar67._12_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar47 >> 4 & 1);
          auVar102._16_4_ = (uint)bVar50 * auVar67._16_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar47 >> 5 & 1);
          auVar102._20_4_ = (uint)bVar50 * auVar67._20_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar47 >> 6 & 1);
          auVar102._24_4_ = (uint)bVar50 * auVar67._24_4_ | (uint)!bVar50 * 0x7f800000;
          auVar102._28_4_ =
               (uint)(bVar47 >> 7) * auVar67._28_4_ | (uint)!(bool)(bVar47 >> 7) * 0x7f800000;
          auVar67 = vshufps_avx(auVar102,auVar102,0xb1);
          auVar67 = vminps_avx(auVar102,auVar67);
          auVar70 = vshufpd_avx(auVar67,auVar67,5);
          auVar67 = vminps_avx(auVar67,auVar70);
          auVar70 = vpermpd_avx2(auVar67,0x4e);
          auVar67 = vminps_avx(auVar67,auVar70);
          uVar14 = vcmpps_avx512vl(auVar102,auVar67,0);
          bVar44 = (byte)uVar14 & bVar47;
          bVar46 = bVar47;
          if (bVar44 != 0) {
            bVar46 = bVar44;
          }
          iVar17 = 0;
          for (uVar54 = (uint)bVar46; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          bVar46 = '\x01' << ((byte)iVar17 & 0x1f);
          aVar1 = (ray->dir).field_0;
          local_560._0_16_ = (undefined1  [16])aVar1;
          auVar60 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar60._0_4_ < 0.0) {
            local_8a0[1] = 0;
            local_8a0[0] = bVar47;
            stack0xfffffffffffff762 = auVar68._2_30_;
            local_8c0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
            local_5a0._0_16_ = ZEXT416(*(uint *)(local_260 + (uint)(iVar17 << 2)));
            fVar126 = sqrtf(auVar60._0_4_);
            bVar47 = local_8a0[0];
            auVar241 = ZEXT3264(local_720);
            auVar238 = ZEXT3264(local_880);
            auVar236 = ZEXT3264(local_860);
            auVar235 = ZEXT3264(local_840);
            auVar234 = ZEXT3264(local_820);
            auVar233 = ZEXT3264(local_800);
            auVar232 = ZEXT3264(local_7e0);
            auVar231 = ZEXT3264(local_7c0);
            auVar230 = ZEXT3264(local_7a0);
            auVar242 = ZEXT3264(local_780);
            auVar239 = ZEXT3264(local_760);
            auVar237 = ZEXT3264(local_6e0);
            auVar240 = ZEXT3264(local_700);
            auVar60 = local_8c0._0_16_;
            auVar58 = local_5a0._0_16_;
          }
          else {
            auVar60 = vsqrtss_avx(auVar60,auVar60);
            fVar126 = auVar60._0_4_;
            auVar60 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar17 << 2)));
            auVar58 = ZEXT416(*(uint *)(local_260 + (uint)(iVar17 << 2)));
          }
          uVar53 = (ulong)bVar46;
          auVar63 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar59 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar61 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar64 = vminps_avx(auVar63,auVar61);
          auVar63 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar61 = vmaxps_avx(auVar59,auVar63);
          auVar169._8_4_ = 0x7fffffff;
          auVar169._0_8_ = 0x7fffffff7fffffff;
          auVar169._12_4_ = 0x7fffffff;
          auVar59 = vandps_avx(auVar64,auVar169);
          auVar63 = vandps_avx(auVar61,auVar169);
          auVar59 = vmaxps_avx(auVar59,auVar63);
          auVar63 = vmovshdup_avx(auVar59);
          auVar63 = vmaxss_avx(auVar63,auVar59);
          auVar59 = vshufpd_avx(auVar59,auVar59,1);
          auVar59 = vmaxss_avx(auVar59,auVar63);
          fVar140 = auVar59._0_4_ * 1.9073486e-06;
          local_4f0 = vshufps_avx(auVar61,auVar61,0xff);
          auVar60 = vinsertps_avx(auVar58,auVar60,0x10);
          uVar48 = 0;
          while( true ) {
            bVar44 = (byte)uVar53;
            if (uVar48 == 5) break;
            uVar111 = auVar60._0_4_;
            auVar115._4_4_ = uVar111;
            auVar115._0_4_ = uVar111;
            auVar115._8_4_ = uVar111;
            auVar115._12_4_ = uVar111;
            auVar59 = vfmadd132ps_fma(auVar115,ZEXT816(0) << 0x40,local_560._0_16_);
            auVar58 = vmovshdup_avx(auVar60);
            local_3c0._0_16_ = auVar58;
            fVar145 = 1.0 - auVar58._0_4_;
            auVar58 = vshufps_avx(auVar60,auVar60,0x55);
            fVar141 = auVar58._0_4_;
            auVar150._0_4_ = local_460._0_4_ * fVar141;
            fVar142 = auVar58._4_4_;
            auVar150._4_4_ = local_460._4_4_ * fVar142;
            fVar144 = auVar58._8_4_;
            auVar150._8_4_ = local_460._8_4_ * fVar144;
            fVar143 = auVar58._12_4_;
            auVar150._12_4_ = local_460._12_4_ * fVar143;
            local_3a0._0_16_ = ZEXT416((uint)fVar145);
            auVar170._4_4_ = fVar145;
            auVar170._0_4_ = fVar145;
            auVar170._8_4_ = fVar145;
            auVar170._12_4_ = fVar145;
            auVar58 = vfmadd231ps_fma(auVar150,auVar170,local_420._0_16_);
            auVar187._0_4_ = local_440._0_4_ * fVar141;
            auVar187._4_4_ = local_440._4_4_ * fVar142;
            auVar187._8_4_ = local_440._8_4_ * fVar144;
            auVar187._12_4_ = local_440._12_4_ * fVar143;
            auVar63 = vfmadd231ps_fma(auVar187,auVar170,local_460._0_16_);
            auVar200._0_4_ = fVar141 * (float)local_480._0_4_;
            auVar200._4_4_ = fVar142 * (float)local_480._4_4_;
            auVar200._8_4_ = fVar144 * fStack_478;
            auVar200._12_4_ = fVar143 * fStack_474;
            auVar61 = vfmadd231ps_fma(auVar200,auVar170,local_440._0_16_);
            auVar206._0_4_ = fVar141 * auVar63._0_4_;
            auVar206._4_4_ = fVar142 * auVar63._4_4_;
            auVar206._8_4_ = fVar144 * auVar63._8_4_;
            auVar206._12_4_ = fVar143 * auVar63._12_4_;
            auVar58 = vfmadd231ps_fma(auVar206,auVar170,auVar58);
            auVar151._0_4_ = fVar141 * auVar61._0_4_;
            auVar151._4_4_ = fVar142 * auVar61._4_4_;
            auVar151._8_4_ = fVar144 * auVar61._8_4_;
            auVar151._12_4_ = fVar143 * auVar61._12_4_;
            auVar63 = vfmadd231ps_fma(auVar151,auVar170,auVar63);
            auVar188._0_4_ = fVar141 * auVar63._0_4_;
            auVar188._4_4_ = fVar142 * auVar63._4_4_;
            auVar188._8_4_ = fVar144 * auVar63._8_4_;
            auVar188._12_4_ = fVar143 * auVar63._12_4_;
            auVar61 = vfmadd231ps_fma(auVar188,auVar58,auVar170);
            auVar58 = vsubps_avx(auVar63,auVar58);
            auVar20._8_4_ = 0x40400000;
            auVar20._0_8_ = 0x4040000040400000;
            auVar20._12_4_ = 0x40400000;
            auVar63 = vmulps_avx512vl(auVar58,auVar20);
            _local_380 = auVar61;
            auVar58 = vsubps_avx(auVar59,auVar61);
            local_8c0._0_16_ = auVar58;
            auVar58 = vdpps_avx(auVar58,auVar58,0x7f);
            _local_8a0 = auVar63;
            local_5a0._0_16_ = auVar58;
            local_520._0_16_ = auVar60;
            if (auVar58._0_4_ < 0.0) {
              auVar217._0_4_ = sqrtf(auVar58._0_4_);
              auVar217._4_60_ = extraout_var;
              auVar60 = auVar217._0_16_;
              uVar53 = extraout_RAX;
              auVar63 = _local_8a0;
            }
            else {
              auVar60 = vsqrtss_avx(auVar58,auVar58);
            }
            local_3e0._0_16_ = vdpps_avx(auVar63,auVar63,0x7f);
            fVar142 = local_3e0._0_4_;
            auVar152._4_12_ = ZEXT812(0) << 0x20;
            auVar152._0_4_ = fVar142;
            local_580._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar152);
            fVar141 = local_580._0_4_ * 1.5;
            local_400._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar152);
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar59 = vxorps_avx512vl(local_3e0._0_16_,auVar21);
            auVar58 = vfnmadd213ss_fma(local_400._0_16_,local_3e0._0_16_,ZEXT416(0x40000000));
            local_540._0_4_ = auVar60._0_4_;
            if (fVar142 < auVar59._0_4_) {
              local_740._0_4_ = fVar141;
              fVar144 = sqrtf(fVar142);
              auVar60 = ZEXT416((uint)local_540._0_4_);
              uVar53 = extraout_RAX_00;
              auVar63 = _local_8a0;
            }
            else {
              auVar59 = vsqrtss_avx(local_3e0._0_16_,local_3e0._0_16_);
              fVar144 = auVar59._0_4_;
              local_740._0_4_ = fVar141;
            }
            fVar141 = local_580._0_4_;
            fVar141 = (float)local_740._0_4_ + fVar142 * -0.5 * fVar141 * fVar141 * fVar141;
            local_740._0_4_ = auVar63._0_4_ * fVar141;
            local_740._4_4_ = auVar63._4_4_ * fVar141;
            fStack_738 = auVar63._8_4_ * fVar141;
            fStack_734 = auVar63._12_4_ * fVar141;
            local_580._0_16_ = vdpps_avx(local_8c0._0_16_,_local_740,0x7f);
            fVar143 = auVar60._0_4_;
            auVar116._0_4_ = local_580._0_4_ * local_580._0_4_;
            auVar116._4_4_ = local_580._4_4_ * local_580._4_4_;
            auVar116._8_4_ = local_580._8_4_ * local_580._8_4_;
            auVar116._12_4_ = local_580._12_4_ * local_580._12_4_;
            auVar59 = vsubps_avx(local_5a0._0_16_,auVar116);
            fVar142 = auVar59._0_4_;
            auVar129._4_12_ = ZEXT812(0) << 0x20;
            auVar129._0_4_ = fVar142;
            auVar61 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar129);
            auVar64 = vmulss_avx512f(auVar61,ZEXT416(0x3fc00000));
            auVar62 = vmulss_avx512f(auVar59,ZEXT416(0xbf000000));
            if (fVar142 < 0.0) {
              local_4d0._0_4_ = auVar62._0_4_;
              local_4e0 = fVar141;
              fStack_4dc = fVar141;
              fStack_4d8 = fVar141;
              fStack_4d4 = fVar141;
              local_4c0 = auVar61;
              fVar142 = sqrtf(fVar142);
              auVar62 = ZEXT416((uint)local_4d0._0_4_);
              auVar64 = ZEXT416(auVar64._0_4_);
              auVar60 = ZEXT416((uint)local_540._0_4_);
              uVar53 = extraout_RAX_01;
              auVar61 = local_4c0;
              auVar63 = _local_8a0;
              fVar141 = local_4e0;
              fVar145 = fStack_4dc;
              fVar146 = fStack_4d8;
              fVar229 = fStack_4d4;
            }
            else {
              auVar59 = vsqrtss_avx(auVar59,auVar59);
              fVar142 = auVar59._0_4_;
              fVar145 = fVar141;
              fVar146 = fVar141;
              fVar229 = fVar141;
            }
            auVar240 = ZEXT3264(local_700);
            auVar237 = ZEXT3264(local_6e0);
            auVar239 = ZEXT3264(local_760);
            auVar242 = ZEXT3264(local_780);
            auVar230 = ZEXT3264(local_7a0);
            auVar231 = ZEXT3264(local_7c0);
            auVar232 = ZEXT3264(local_7e0);
            auVar233 = ZEXT3264(local_800);
            auVar234 = ZEXT3264(local_820);
            auVar235 = ZEXT3264(local_840);
            auVar236 = ZEXT3264(local_860);
            auVar238 = ZEXT3264(local_880);
            auVar241 = ZEXT3264(local_720);
            auVar66 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                      local_3c0._0_16_);
            auVar59 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3c0._0_16_,
                                      local_3a0._0_16_);
            fVar147 = auVar59._0_4_ * 6.0;
            fVar12 = local_3c0._0_4_ * 6.0;
            auVar171._0_4_ = fVar12 * (float)local_480._0_4_;
            auVar171._4_4_ = fVar12 * (float)local_480._4_4_;
            auVar171._8_4_ = fVar12 * fStack_478;
            auVar171._12_4_ = fVar12 * fStack_474;
            auVar153._4_4_ = fVar147;
            auVar153._0_4_ = fVar147;
            auVar153._8_4_ = fVar147;
            auVar153._12_4_ = fVar147;
            auVar59 = vfmadd132ps_fma(auVar153,auVar171,local_440._0_16_);
            fVar147 = auVar66._0_4_ * 6.0;
            auVar130._4_4_ = fVar147;
            auVar130._0_4_ = fVar147;
            auVar130._8_4_ = fVar147;
            auVar130._12_4_ = fVar147;
            auVar59 = vfmadd132ps_fma(auVar130,auVar59,local_460._0_16_);
            fVar147 = local_3a0._0_4_ * 6.0;
            auVar154._4_4_ = fVar147;
            auVar154._0_4_ = fVar147;
            auVar154._8_4_ = fVar147;
            auVar154._12_4_ = fVar147;
            auVar59 = vfmadd132ps_fma(auVar154,auVar59,local_420._0_16_);
            auVar131._0_4_ = auVar59._0_4_ * (float)local_3e0._0_4_;
            auVar131._4_4_ = auVar59._4_4_ * (float)local_3e0._0_4_;
            auVar131._8_4_ = auVar59._8_4_ * (float)local_3e0._0_4_;
            auVar131._12_4_ = auVar59._12_4_ * (float)local_3e0._0_4_;
            auVar59 = vdpps_avx(auVar63,auVar59,0x7f);
            fVar147 = auVar59._0_4_;
            auVar155._0_4_ = auVar63._0_4_ * fVar147;
            auVar155._4_4_ = auVar63._4_4_ * fVar147;
            auVar155._8_4_ = auVar63._8_4_ * fVar147;
            auVar155._12_4_ = auVar63._12_4_ * fVar147;
            auVar59 = vsubps_avx(auVar131,auVar155);
            fVar147 = auVar58._0_4_ * (float)local_400._0_4_;
            auVar66 = vmaxss_avx(ZEXT416((uint)fVar140),
                                 ZEXT416((uint)(local_520._0_4_ * fVar126 * 1.9073486e-06)));
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar65 = vxorps_avx512vl(auVar63,auVar22);
            auVar156._0_4_ = fVar141 * auVar59._0_4_ * fVar147;
            auVar156._4_4_ = fVar145 * auVar59._4_4_ * fVar147;
            auVar156._8_4_ = fVar146 * auVar59._8_4_ * fVar147;
            auVar156._12_4_ = fVar229 * auVar59._12_4_ * fVar147;
            auVar58 = vdpps_avx(auVar65,_local_740,0x7f);
            auVar59 = vfmadd213ss_fma(auVar60,ZEXT416((uint)fVar140),auVar66);
            auVar60 = vdpps_avx(local_8c0._0_16_,auVar156,0x7f);
            auVar13 = vfmadd213ss_fma(ZEXT416((uint)(fVar143 + 1.0)),
                                      ZEXT416((uint)(fVar140 / fVar144)),auVar59);
            fVar141 = auVar58._0_4_ + auVar60._0_4_;
            auVar60 = vdpps_avx(local_560._0_16_,_local_740,0x7f);
            auVar58 = vdpps_avx(local_8c0._0_16_,auVar65,0x7f);
            auVar59 = vmulss_avx512f(auVar62,auVar61);
            auVar61 = vmulss_avx512f(auVar61,auVar61);
            auVar64 = vaddss_avx512f(auVar64,ZEXT416((uint)(auVar59._0_4_ * auVar61._0_4_)));
            auVar59 = vdpps_avx(local_8c0._0_16_,local_560._0_16_,0x7f);
            auVar62 = vfnmadd231ss_avx512f(auVar58,local_580._0_16_,ZEXT416((uint)fVar141));
            auVar59 = vfnmadd231ss_avx512f(auVar59,local_580._0_16_,auVar60);
            auVar58 = vpermilps_avx(_local_380,0xff);
            fVar142 = fVar142 - auVar58._0_4_;
            auVar61 = vshufps_avx(auVar63,auVar63,0xff);
            auVar58 = vfmsub213ss_fma(auVar62,auVar64,auVar61);
            auVar213._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
            auVar213._8_4_ = auVar58._8_4_ ^ 0x80000000;
            auVar213._12_4_ = auVar58._12_4_ ^ 0x80000000;
            auVar59 = ZEXT416((uint)(auVar59._0_4_ * auVar64._0_4_));
            auVar64 = vfmsub231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar58._0_4_)),
                                      ZEXT416((uint)fVar141),auVar59);
            auVar58 = vinsertps_avx(auVar213,auVar59,0x1c);
            auVar201._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
            auVar201._8_4_ = auVar60._8_4_ ^ 0x80000000;
            auVar201._12_4_ = auVar60._12_4_ ^ 0x80000000;
            auVar59 = vinsertps_avx(ZEXT416((uint)fVar141),auVar201,0x10);
            auVar172._0_4_ = auVar64._0_4_;
            auVar172._4_4_ = auVar172._0_4_;
            auVar172._8_4_ = auVar172._0_4_;
            auVar172._12_4_ = auVar172._0_4_;
            auVar60 = vdivps_avx(auVar58,auVar172);
            auVar58 = vdivps_avx(auVar59,auVar172);
            auVar59 = vbroadcastss_avx512vl(local_580._0_16_);
            auVar173._0_4_ = auVar59._0_4_ * auVar60._0_4_ + fVar142 * auVar58._0_4_;
            auVar173._4_4_ = auVar59._4_4_ * auVar60._4_4_ + fVar142 * auVar58._4_4_;
            auVar173._8_4_ = auVar59._8_4_ * auVar60._8_4_ + fVar142 * auVar58._8_4_;
            auVar173._12_4_ = auVar59._12_4_ * auVar60._12_4_ + fVar142 * auVar58._12_4_;
            auVar60 = vsubps_avx(local_520._0_16_,auVar173);
            auVar23._8_4_ = 0x7fffffff;
            auVar23._0_8_ = 0x7fffffff7fffffff;
            auVar23._12_4_ = 0x7fffffff;
            auVar58 = vandps_avx512vl(local_580._0_16_,auVar23);
            if (auVar58._0_4_ < auVar13._0_4_) {
              auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar66._0_4_)),local_4f0,
                                        ZEXT416(0x36000000));
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar59 = vandps_avx512vl(ZEXT416((uint)fVar142),auVar24);
              if (auVar59._0_4_ < auVar58._0_4_) {
                bVar50 = uVar48 < 5;
                fVar126 = auVar60._0_4_ + (float)local_500._0_4_;
                bVar44 = 0;
                if ((fVar126 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar126))
                goto LAB_018217f5;
                auVar60 = vmovshdup_avx(auVar60);
                fVar140 = auVar60._0_4_;
                bVar44 = 0;
                if ((fVar140 < 0.0) || (bVar44 = 0, 1.0 < fVar140)) goto LAB_018217f5;
                auVar60 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5a0._0_4_));
                fVar141 = auVar60._0_4_;
                pGVar3 = (context->scene->geometries).items[local_8c8].ptr;
                if ((pGVar3->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar44 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_018217f5;
                  local_8a0._0_4_ = ray->tfar;
                  fVar141 = fVar141 * 1.5 + local_5a0._0_4_ * -0.5 * fVar141 * fVar141 * fVar141;
                  auVar174._0_4_ = local_8c0._0_4_ * fVar141;
                  auVar174._4_4_ = local_8c0._4_4_ * fVar141;
                  auVar174._8_4_ = local_8c0._8_4_ * fVar141;
                  auVar174._12_4_ = local_8c0._12_4_ * fVar141;
                  auVar61 = vfmadd213ps_fma(auVar61,auVar174,auVar63);
                  auVar60 = vshufps_avx(auVar174,auVar174,0xc9);
                  auVar58 = vshufps_avx(auVar63,auVar63,0xc9);
                  auVar175._0_4_ = auVar174._0_4_ * auVar58._0_4_;
                  auVar175._4_4_ = auVar174._4_4_ * auVar58._4_4_;
                  auVar175._8_4_ = auVar174._8_4_ * auVar58._8_4_;
                  auVar175._12_4_ = auVar174._12_4_ * auVar58._12_4_;
                  auVar59 = vfmsub231ps_fma(auVar175,auVar63,auVar60);
                  auVar60 = vshufps_avx(auVar59,auVar59,0xc9);
                  auVar58 = vshufps_avx(auVar61,auVar61,0xc9);
                  auVar59 = vshufps_avx(auVar59,auVar59,0xd2);
                  auVar117._0_4_ = auVar61._0_4_ * auVar59._0_4_;
                  auVar117._4_4_ = auVar61._4_4_ * auVar59._4_4_;
                  auVar117._8_4_ = auVar61._8_4_ * auVar59._8_4_;
                  auVar117._12_4_ = auVar61._12_4_ * auVar59._12_4_;
                  auVar58 = vfmsub231ps_fma(auVar117,auVar60,auVar58);
                  auVar60 = vshufps_avx(auVar58,auVar58,0xe9);
                  local_680 = vmovlps_avx(auVar60);
                  local_678 = auVar58._0_4_;
                  local_670 = 0;
                  local_66c = (undefined4)local_8d0;
                  local_668 = (undefined4)local_8c8;
                  local_664 = context->user->instID[0];
                  local_660 = context->user->instPrimID[0];
                  ray->tfar = fVar126;
                  local_8d4 = -1;
                  local_6b0.valid = &local_8d4;
                  local_6b0.geometryUserPtr = pGVar3->userPtr;
                  local_6b0.context = context->user;
                  local_6b0.hit = (RTCHitN *)&local_680;
                  local_6b0.N = 1;
                  local_8c0._0_8_ = pGVar3;
                  local_6b0.ray = (RTCRayN *)ray;
                  local_674 = fVar140;
                  if (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01821a51:
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_8c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                      (*p_Var4)(&local_6b0);
                      auVar241 = ZEXT3264(local_720);
                      auVar238 = ZEXT3264(local_880);
                      auVar236 = ZEXT3264(local_860);
                      auVar235 = ZEXT3264(local_840);
                      auVar234 = ZEXT3264(local_820);
                      auVar233 = ZEXT3264(local_800);
                      auVar232 = ZEXT3264(local_7e0);
                      auVar231 = ZEXT3264(local_7c0);
                      auVar230 = ZEXT3264(local_7a0);
                      auVar242 = ZEXT3264(local_780);
                      auVar239 = ZEXT3264(local_760);
                      auVar237 = ZEXT3264(local_6e0);
                      auVar240 = ZEXT3264(local_700);
                      if (*local_6b0.valid == 0) goto LAB_01821b05;
                    }
                    bVar44 = 1;
                    goto LAB_018217f5;
                  }
                  (*pGVar3->occlusionFilterN)(&local_6b0);
                  auVar241 = ZEXT3264(local_720);
                  auVar238 = ZEXT3264(local_880);
                  auVar236 = ZEXT3264(local_860);
                  auVar235 = ZEXT3264(local_840);
                  auVar234 = ZEXT3264(local_820);
                  auVar233 = ZEXT3264(local_800);
                  auVar232 = ZEXT3264(local_7e0);
                  auVar231 = ZEXT3264(local_7c0);
                  auVar230 = ZEXT3264(local_7a0);
                  auVar242 = ZEXT3264(local_780);
                  auVar239 = ZEXT3264(local_760);
                  auVar237 = ZEXT3264(local_6e0);
                  auVar240 = ZEXT3264(local_700);
                  if (*local_6b0.valid != 0) goto LAB_01821a51;
LAB_01821b05:
                  ray->tfar = (float)local_8a0._0_4_;
                }
                bVar44 = 0;
                goto LAB_018217f5;
              }
            }
            uVar48 = uVar48 + 1;
          }
          bVar50 = false;
LAB_018217f5:
          bVar49 = bVar49 | bVar50 & bVar44;
          fVar126 = ray->tfar;
          auVar31._4_4_ = fVar126;
          auVar31._0_4_ = fVar126;
          auVar31._8_4_ = fVar126;
          auVar31._12_4_ = fVar126;
          auVar31._16_4_ = fVar126;
          auVar31._20_4_ = fVar126;
          auVar31._24_4_ = fVar126;
          auVar31._28_4_ = fVar126;
          uVar14 = vcmpps_avx512vl(_local_320,auVar31,2);
        }
        auVar138._0_4_ = (float)local_360._0_4_ + (float)local_340._0_4_;
        auVar138._4_4_ = (float)local_360._4_4_ + (float)local_340._4_4_;
        auVar138._8_4_ = fStack_358 + fStack_338;
        auVar138._12_4_ = fStack_354 + fStack_334;
        auVar138._16_4_ = fStack_350 + fStack_330;
        auVar138._20_4_ = fStack_34c + fStack_32c;
        auVar138._24_4_ = fStack_348 + fStack_328;
        auVar138._28_4_ = fStack_344 + fStack_324;
        fVar140 = ray->tfar;
        fVar126 = ray->tfar;
        auVar32._4_4_ = fVar126;
        auVar32._0_4_ = fVar126;
        auVar32._8_4_ = fVar126;
        auVar32._12_4_ = fVar126;
        auVar32._16_4_ = fVar126;
        auVar32._20_4_ = fVar126;
        auVar32._24_4_ = fVar126;
        auVar32._28_4_ = fVar126;
        uVar14 = vcmpps_avx512vl(auVar138,auVar32,2);
        auVar139._8_4_ = 2;
        auVar139._0_8_ = 0x200000002;
        auVar139._12_4_ = 2;
        auVar139._16_4_ = 2;
        auVar139._20_4_ = 2;
        auVar139._24_4_ = 2;
        auVar139._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar68 = vpblendmd_avx512vl(auVar139,auVar33);
        bVar50 = (bool)((byte)local_728 & 1);
        local_340._0_4_ = (uint)bVar50 * auVar68._0_4_ | (uint)!bVar50 * 2;
        bVar50 = (bool)((byte)(local_728 >> 1) & 1);
        local_340._4_4_ = (uint)bVar50 * auVar68._4_4_ | (uint)!bVar50 * 2;
        bVar50 = (bool)((byte)(local_728 >> 2) & 1);
        fStack_338 = (float)((uint)bVar50 * auVar68._8_4_ | (uint)!bVar50 * 2);
        bVar50 = (bool)((byte)(local_728 >> 3) & 1);
        fStack_334 = (float)((uint)bVar50 * auVar68._12_4_ | (uint)!bVar50 * 2);
        bVar50 = (bool)((byte)(local_728 >> 4) & 1);
        fStack_330 = (float)((uint)bVar50 * auVar68._16_4_ | (uint)!bVar50 * 2);
        bVar50 = (bool)((byte)(local_728 >> 5) & 1);
        fStack_32c = (float)((uint)bVar50 * auVar68._20_4_ | (uint)!bVar50 * 2);
        bVar50 = (bool)((byte)(local_728 >> 6) & 1);
        fStack_328 = (float)((uint)bVar50 * auVar68._24_4_ | (uint)!bVar50 * 2);
        bVar50 = (bool)((byte)(local_728 >> 7) & 1);
        fStack_324 = (float)((uint)bVar50 * auVar68._28_4_ | (uint)!bVar50 * 2);
        bVar43 = (byte)uVar15 & bVar43 & (byte)uVar14;
        uVar14 = vpcmpd_avx512vl(_local_340,local_2c0,2);
        local_300 = _local_2a0;
        local_320._4_4_ = (float)local_360._4_4_ + (float)local_2a0._4_4_;
        local_320._0_4_ = (float)local_360._0_4_ + (float)local_2a0._0_4_;
        fStack_318 = fStack_358 + fStack_298;
        fStack_314 = fStack_354 + fStack_294;
        fStack_310 = fStack_350 + fStack_290;
        fStack_30c = fStack_34c + fStack_28c;
        fStack_308 = fStack_348 + fStack_288;
        fStack_304 = fStack_344 + fStack_284;
        auVar221 = ZEXT3264(local_5c0);
        auVar223 = ZEXT3264(local_5e0);
        auVar225 = ZEXT3264(local_600);
        auVar217 = ZEXT3264(local_620);
        auVar209 = ZEXT3264(local_640);
        for (bVar46 = (byte)uVar14 & bVar43; auVar68 = _local_8a0, bVar46 != 0;
            bVar46 = ~bVar47 & bVar46 & (byte)uVar14) {
          auVar125._8_4_ = 0x7f800000;
          auVar125._0_8_ = 0x7f8000007f800000;
          auVar125._12_4_ = 0x7f800000;
          auVar125._16_4_ = 0x7f800000;
          auVar125._20_4_ = 0x7f800000;
          auVar125._24_4_ = 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar67 = vblendmps_avx512vl(auVar125,local_300);
          auVar103._0_4_ =
               (uint)(bVar46 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar46 & 1) * 0x7f800000;
          bVar50 = (bool)(bVar46 >> 1 & 1);
          auVar103._4_4_ = (uint)bVar50 * auVar67._4_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar46 >> 2 & 1);
          auVar103._8_4_ = (uint)bVar50 * auVar67._8_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar46 >> 3 & 1);
          auVar103._12_4_ = (uint)bVar50 * auVar67._12_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar46 >> 4 & 1);
          auVar103._16_4_ = (uint)bVar50 * auVar67._16_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar46 >> 5 & 1);
          auVar103._20_4_ = (uint)bVar50 * auVar67._20_4_ | (uint)!bVar50 * 0x7f800000;
          bVar50 = (bool)(bVar46 >> 6 & 1);
          auVar103._24_4_ = (uint)bVar50 * auVar67._24_4_ | (uint)!bVar50 * 0x7f800000;
          auVar103._28_4_ =
               (uint)(bVar46 >> 7) * auVar67._28_4_ | (uint)!(bool)(bVar46 >> 7) * 0x7f800000;
          auVar67 = vshufps_avx(auVar103,auVar103,0xb1);
          auVar67 = vminps_avx(auVar103,auVar67);
          auVar70 = vshufpd_avx(auVar67,auVar67,5);
          auVar67 = vminps_avx(auVar67,auVar70);
          auVar70 = vpermpd_avx2(auVar67,0x4e);
          auVar67 = vminps_avx(auVar67,auVar70);
          uVar14 = vcmpps_avx512vl(auVar103,auVar67,0);
          bVar44 = (byte)uVar14 & bVar46;
          bVar47 = bVar46;
          if (bVar44 != 0) {
            bVar47 = bVar44;
          }
          iVar17 = 0;
          for (uVar54 = (uint)bVar47; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x80000000) {
            iVar17 = iVar17 + 1;
          }
          bVar47 = '\x01' << ((byte)iVar17 & 0x1f);
          aVar1 = (ray->dir).field_0;
          local_5a0._0_16_ = (undefined1  [16])aVar1;
          auVar60 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar60._0_4_ < 0.0) {
            local_8a0[1] = 0;
            local_8a0[0] = bVar46;
            stack0xfffffffffffff762 = auVar68._2_30_;
            local_8c0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
            local_560._0_16_ = ZEXT416(*(uint *)(local_280 + (uint)(iVar17 << 2)));
            fVar126 = sqrtf(auVar60._0_4_);
            bVar46 = local_8a0[0];
            auVar241 = ZEXT3264(local_720);
            auVar238 = ZEXT3264(local_880);
            auVar236 = ZEXT3264(local_860);
            auVar235 = ZEXT3264(local_840);
            auVar234 = ZEXT3264(local_820);
            auVar233 = ZEXT3264(local_800);
            auVar232 = ZEXT3264(local_7e0);
            auVar231 = ZEXT3264(local_7c0);
            auVar230 = ZEXT3264(local_7a0);
            auVar242 = ZEXT3264(local_780);
            auVar209 = ZEXT3264(local_640);
            auVar217 = ZEXT3264(local_620);
            auVar225 = ZEXT3264(local_600);
            auVar223 = ZEXT3264(local_5e0);
            auVar221 = ZEXT3264(local_5c0);
            auVar239 = ZEXT3264(local_760);
            auVar237 = ZEXT3264(local_6e0);
            auVar240 = ZEXT3264(local_700);
            auVar60 = local_560._0_16_;
            auVar58 = local_8c0._0_16_;
          }
          else {
            auVar60 = vsqrtss_avx(auVar60,auVar60);
            fVar126 = auVar60._0_4_;
            auVar60 = ZEXT416(*(uint *)(local_280 + (uint)(iVar17 << 2)));
            auVar58 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar17 << 2)));
          }
          uVar53 = (ulong)bVar47;
          auVar63 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar59 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar61 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar64 = vminps_avx(auVar63,auVar61);
          auVar63 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar61 = vmaxps_avx(auVar59,auVar63);
          auVar176._8_4_ = 0x7fffffff;
          auVar176._0_8_ = 0x7fffffff7fffffff;
          auVar176._12_4_ = 0x7fffffff;
          auVar59 = vandps_avx(auVar64,auVar176);
          auVar63 = vandps_avx(auVar61,auVar176);
          auVar59 = vmaxps_avx(auVar59,auVar63);
          auVar63 = vmovshdup_avx(auVar59);
          auVar63 = vmaxss_avx(auVar63,auVar59);
          auVar59 = vshufpd_avx(auVar59,auVar59,1);
          auVar59 = vmaxss_avx(auVar59,auVar63);
          fVar140 = auVar59._0_4_ * 1.9073486e-06;
          local_4f0 = vshufps_avx(auVar61,auVar61,0xff);
          auVar60 = vinsertps_avx(auVar60,auVar58,0x10);
          uVar48 = 0;
          while( true ) {
            bVar44 = (byte)uVar53;
            if (uVar48 == 5) break;
            uVar111 = auVar60._0_4_;
            auVar118._4_4_ = uVar111;
            auVar118._0_4_ = uVar111;
            auVar118._8_4_ = uVar111;
            auVar118._12_4_ = uVar111;
            auVar59 = vfmadd132ps_fma(auVar118,ZEXT816(0) << 0x40,local_5a0._0_16_);
            auVar58 = vmovshdup_avx(auVar60);
            local_3c0._0_16_ = auVar58;
            fVar145 = 1.0 - auVar58._0_4_;
            auVar58 = vshufps_avx(auVar60,auVar60,0x55);
            fVar141 = auVar58._0_4_;
            auVar157._0_4_ = local_460._0_4_ * fVar141;
            fVar142 = auVar58._4_4_;
            auVar157._4_4_ = local_460._4_4_ * fVar142;
            fVar144 = auVar58._8_4_;
            auVar157._8_4_ = local_460._8_4_ * fVar144;
            fVar143 = auVar58._12_4_;
            auVar157._12_4_ = local_460._12_4_ * fVar143;
            local_3a0._0_16_ = ZEXT416((uint)fVar145);
            auVar177._4_4_ = fVar145;
            auVar177._0_4_ = fVar145;
            auVar177._8_4_ = fVar145;
            auVar177._12_4_ = fVar145;
            auVar58 = vfmadd231ps_fma(auVar157,auVar177,local_420._0_16_);
            auVar189._0_4_ = local_440._0_4_ * fVar141;
            auVar189._4_4_ = local_440._4_4_ * fVar142;
            auVar189._8_4_ = local_440._8_4_ * fVar144;
            auVar189._12_4_ = local_440._12_4_ * fVar143;
            auVar63 = vfmadd231ps_fma(auVar189,auVar177,local_460._0_16_);
            auVar202._0_4_ = fVar141 * (float)local_480._0_4_;
            auVar202._4_4_ = fVar142 * (float)local_480._4_4_;
            auVar202._8_4_ = fVar144 * fStack_478;
            auVar202._12_4_ = fVar143 * fStack_474;
            auVar61 = vfmadd231ps_fma(auVar202,auVar177,local_440._0_16_);
            auVar207._0_4_ = fVar141 * auVar63._0_4_;
            auVar207._4_4_ = fVar142 * auVar63._4_4_;
            auVar207._8_4_ = fVar144 * auVar63._8_4_;
            auVar207._12_4_ = fVar143 * auVar63._12_4_;
            auVar58 = vfmadd231ps_fma(auVar207,auVar177,auVar58);
            auVar158._0_4_ = fVar141 * auVar61._0_4_;
            auVar158._4_4_ = fVar142 * auVar61._4_4_;
            auVar158._8_4_ = fVar144 * auVar61._8_4_;
            auVar158._12_4_ = fVar143 * auVar61._12_4_;
            auVar63 = vfmadd231ps_fma(auVar158,auVar177,auVar63);
            auVar190._0_4_ = fVar141 * auVar63._0_4_;
            auVar190._4_4_ = fVar142 * auVar63._4_4_;
            auVar190._8_4_ = fVar144 * auVar63._8_4_;
            auVar190._12_4_ = fVar143 * auVar63._12_4_;
            auVar61 = vfmadd231ps_fma(auVar190,auVar58,auVar177);
            auVar58 = vsubps_avx(auVar63,auVar58);
            auVar25._8_4_ = 0x40400000;
            auVar25._0_8_ = 0x4040000040400000;
            auVar25._12_4_ = 0x40400000;
            auVar63 = vmulps_avx512vl(auVar58,auVar25);
            _local_380 = auVar61;
            auVar58 = vsubps_avx(auVar59,auVar61);
            _local_8a0 = auVar58;
            auVar58 = vdpps_avx(auVar58,auVar58,0x7f);
            local_8c0._0_16_ = auVar63;
            local_560._0_16_ = auVar58;
            local_520._0_16_ = auVar60;
            if (auVar58._0_4_ < 0.0) {
              auVar221._0_4_ = sqrtf(auVar58._0_4_);
              auVar221._4_60_ = extraout_var_00;
              auVar60 = auVar221._0_16_;
              uVar53 = extraout_RAX_02;
              auVar63 = local_8c0._0_16_;
            }
            else {
              auVar60 = vsqrtss_avx(auVar58,auVar58);
            }
            local_3e0._0_16_ = vdpps_avx(auVar63,auVar63,0x7f);
            fVar142 = local_3e0._0_4_;
            auVar159._4_12_ = ZEXT812(0) << 0x20;
            auVar159._0_4_ = fVar142;
            local_580._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
            fVar141 = local_580._0_4_ * 1.5;
            local_400._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar59 = vxorps_avx512vl(local_3e0._0_16_,auVar26);
            auVar58 = vfnmadd213ss_fma(local_400._0_16_,local_3e0._0_16_,ZEXT416(0x40000000));
            local_540._0_4_ = auVar60._0_4_;
            if (fVar142 < auVar59._0_4_) {
              local_740._0_4_ = fVar141;
              fVar144 = sqrtf(fVar142);
              auVar60 = ZEXT416((uint)local_540._0_4_);
              uVar53 = extraout_RAX_03;
              auVar63 = local_8c0._0_16_;
            }
            else {
              auVar59 = vsqrtss_avx(local_3e0._0_16_,local_3e0._0_16_);
              fVar144 = auVar59._0_4_;
              local_740._0_4_ = fVar141;
            }
            fVar141 = local_580._0_4_;
            local_740._4_4_ = (float)local_740._0_4_ + fVar142 * -0.5 * fVar141 * fVar141 * fVar141;
            local_740._0_4_ = local_740._4_4_;
            fStack_738 = (float)local_740._4_4_;
            fStack_734 = (float)local_740._4_4_;
            auVar228._0_4_ = auVar63._0_4_ * (float)local_740._4_4_;
            auVar228._4_4_ = auVar63._4_4_ * (float)local_740._4_4_;
            auVar228._8_4_ = auVar63._8_4_ * (float)local_740._4_4_;
            auVar228._12_4_ = auVar63._12_4_ * (float)local_740._4_4_;
            local_580._0_16_ = vdpps_avx(auVar228,_local_8a0,0x7f);
            auVar64 = vaddss_avx512f(auVar60,ZEXT416(0x3f800000));
            auVar119._0_4_ = local_580._0_4_ * local_580._0_4_;
            auVar119._4_4_ = local_580._4_4_ * local_580._4_4_;
            auVar119._8_4_ = local_580._8_4_ * local_580._8_4_;
            auVar119._12_4_ = local_580._12_4_ * local_580._12_4_;
            auVar59 = vsubps_avx(local_560._0_16_,auVar119);
            fVar141 = auVar59._0_4_;
            auVar132._4_12_ = ZEXT812(0) << 0x20;
            auVar132._0_4_ = fVar141;
            auVar61 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar132);
            auVar62 = vmulss_avx512f(auVar61,ZEXT416(0x3fc00000));
            auVar66 = vmulss_avx512f(auVar59,ZEXT416(0xbf000000));
            uVar52 = fVar141 == 0.0;
            uVar51 = fVar141 < 0.0;
            if ((bool)uVar51) {
              local_4e0 = auVar66._0_4_;
              local_4d0 = auVar228;
              local_4c0 = auVar61;
              fVar141 = sqrtf(fVar141);
              auVar66 = ZEXT416((uint)local_4e0);
              auVar62 = ZEXT416(auVar62._0_4_);
              auVar60 = ZEXT416((uint)local_540._0_4_);
              auVar64 = ZEXT416(auVar64._0_4_);
              uVar53 = extraout_RAX_04;
              auVar228 = local_4d0;
              auVar61 = local_4c0;
              auVar63 = local_8c0._0_16_;
            }
            else {
              auVar59 = vsqrtss_avx(auVar59,auVar59);
              fVar141 = auVar59._0_4_;
            }
            auVar240 = ZEXT3264(local_700);
            auVar237 = ZEXT3264(local_6e0);
            auVar239 = ZEXT3264(local_760);
            auVar221 = ZEXT3264(local_5c0);
            auVar223 = ZEXT3264(local_5e0);
            auVar225 = ZEXT3264(local_600);
            auVar242 = ZEXT3264(local_780);
            auVar230 = ZEXT3264(local_7a0);
            auVar231 = ZEXT3264(local_7c0);
            auVar232 = ZEXT3264(local_7e0);
            auVar233 = ZEXT3264(local_800);
            auVar234 = ZEXT3264(local_820);
            auVar235 = ZEXT3264(local_840);
            auVar236 = ZEXT3264(local_860);
            auVar238 = ZEXT3264(local_880);
            auVar241 = ZEXT3264(local_720);
            auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                      local_3c0._0_16_);
            auVar59 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3c0._0_16_,
                                      local_3a0._0_16_);
            fVar142 = auVar59._0_4_ * 6.0;
            fVar143 = local_3c0._0_4_ * 6.0;
            auVar178._0_4_ = fVar143 * (float)local_480._0_4_;
            auVar178._4_4_ = fVar143 * (float)local_480._4_4_;
            auVar178._8_4_ = fVar143 * fStack_478;
            auVar178._12_4_ = fVar143 * fStack_474;
            auVar160._4_4_ = fVar142;
            auVar160._0_4_ = fVar142;
            auVar160._8_4_ = fVar142;
            auVar160._12_4_ = fVar142;
            auVar59 = vfmadd132ps_fma(auVar160,auVar178,local_440._0_16_);
            fVar142 = auVar13._0_4_ * 6.0;
            auVar133._4_4_ = fVar142;
            auVar133._0_4_ = fVar142;
            auVar133._8_4_ = fVar142;
            auVar133._12_4_ = fVar142;
            auVar59 = vfmadd132ps_fma(auVar133,auVar59,local_460._0_16_);
            fVar142 = local_3a0._0_4_ * 6.0;
            auVar161._4_4_ = fVar142;
            auVar161._0_4_ = fVar142;
            auVar161._8_4_ = fVar142;
            auVar161._12_4_ = fVar142;
            auVar59 = vfmadd132ps_fma(auVar161,auVar59,local_420._0_16_);
            auVar134._0_4_ = auVar59._0_4_ * (float)local_3e0._0_4_;
            auVar134._4_4_ = auVar59._4_4_ * (float)local_3e0._0_4_;
            auVar134._8_4_ = auVar59._8_4_ * (float)local_3e0._0_4_;
            auVar134._12_4_ = auVar59._12_4_ * (float)local_3e0._0_4_;
            auVar59 = vdpps_avx(auVar63,auVar59,0x7f);
            fVar142 = auVar59._0_4_;
            auVar162._0_4_ = auVar63._0_4_ * fVar142;
            auVar162._4_4_ = auVar63._4_4_ * fVar142;
            auVar162._8_4_ = auVar63._8_4_ * fVar142;
            auVar162._12_4_ = auVar63._12_4_ * fVar142;
            auVar59 = vsubps_avx(auVar134,auVar162);
            fVar142 = auVar58._0_4_ * (float)local_400._0_4_;
            auVar13 = vmaxss_avx(ZEXT416((uint)fVar140),
                                 ZEXT416((uint)(local_520._0_4_ * fVar126 * 1.9073486e-06)));
            auVar27._8_4_ = 0x80000000;
            auVar27._0_8_ = 0x8000000080000000;
            auVar27._12_4_ = 0x80000000;
            auVar65 = vxorps_avx512vl(auVar63,auVar27);
            auVar163._0_4_ = auVar59._0_4_ * fVar142 * (float)local_740._0_4_;
            auVar163._4_4_ = auVar59._4_4_ * fVar142 * (float)local_740._4_4_;
            auVar163._8_4_ = auVar59._8_4_ * fVar142 * fStack_738;
            auVar163._12_4_ = auVar59._12_4_ * fVar142 * fStack_734;
            auVar58 = vdpps_avx(auVar65,auVar228,0x7f);
            auVar59 = vfmadd213ss_fma(auVar60,ZEXT416((uint)fVar140),auVar13);
            auVar60 = vdpps_avx(_local_8a0,auVar163,0x7f);
            vfmadd213ss_avx512f(auVar64,ZEXT416((uint)(fVar140 / fVar144)),auVar59);
            fVar142 = auVar58._0_4_ + auVar60._0_4_;
            auVar60 = vdpps_avx(local_5a0._0_16_,auVar228,0x7f);
            auVar58 = vdpps_avx(_local_8a0,auVar65,0x7f);
            auVar59 = vmulss_avx512f(auVar66,auVar61);
            auVar61 = vmulss_avx512f(auVar61,auVar61);
            auVar64 = vaddss_avx512f(auVar62,ZEXT416((uint)(auVar59._0_4_ * auVar61._0_4_)));
            auVar59 = vdpps_avx(_local_8a0,local_5a0._0_16_,0x7f);
            auVar62 = vfnmadd231ss_avx512f(auVar58,local_580._0_16_,ZEXT416((uint)fVar142));
            auVar59 = vfnmadd231ss_avx512f(auVar59,local_580._0_16_,auVar60);
            auVar58 = vpermilps_avx(_local_380,0xff);
            fVar141 = fVar141 - auVar58._0_4_;
            auVar61 = vshufps_avx(auVar63,auVar63,0xff);
            auVar58 = vfmsub213ss_fma(auVar62,auVar64,auVar61);
            auVar214._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
            auVar214._8_4_ = auVar58._8_4_ ^ 0x80000000;
            auVar214._12_4_ = auVar58._12_4_ ^ 0x80000000;
            auVar59 = ZEXT416((uint)(auVar59._0_4_ * auVar64._0_4_));
            auVar64 = vfmsub231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar58._0_4_)),
                                      ZEXT416((uint)fVar142),auVar59);
            auVar58 = vinsertps_avx(auVar214,auVar59,0x1c);
            auVar203._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
            auVar203._8_4_ = auVar60._8_4_ ^ 0x80000000;
            auVar203._12_4_ = auVar60._12_4_ ^ 0x80000000;
            auVar59 = vinsertps_avx(ZEXT416((uint)fVar142),auVar203,0x10);
            auVar179._0_4_ = auVar64._0_4_;
            auVar179._4_4_ = auVar179._0_4_;
            auVar179._8_4_ = auVar179._0_4_;
            auVar179._12_4_ = auVar179._0_4_;
            auVar60 = vdivps_avx(auVar58,auVar179);
            auVar58 = vdivps_avx(auVar59,auVar179);
            auVar59 = vbroadcastss_avx512vl(local_580._0_16_);
            auVar180._0_4_ = auVar59._0_4_ * auVar60._0_4_ + fVar141 * auVar58._0_4_;
            auVar180._4_4_ = auVar59._4_4_ * auVar60._4_4_ + fVar141 * auVar58._4_4_;
            auVar180._8_4_ = auVar59._8_4_ * auVar60._8_4_ + fVar141 * auVar58._8_4_;
            auVar180._12_4_ = auVar59._12_4_ * auVar60._12_4_ + fVar141 * auVar58._12_4_;
            auVar60 = vsubps_avx(local_520._0_16_,auVar180);
            auVar28._8_4_ = 0x7fffffff;
            auVar28._0_8_ = 0x7fffffff7fffffff;
            auVar28._12_4_ = 0x7fffffff;
            auVar58 = vandps_avx512vl(local_580._0_16_,auVar28);
            auVar58 = vucomiss_avx512f(auVar58);
            if (!(bool)uVar51 && !(bool)uVar52) {
              auVar58 = vaddss_avx512f(auVar13,auVar58);
              auVar58 = vfmadd231ss_fma(auVar58,local_4f0,ZEXT416(0x36000000));
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar59 = vandps_avx512vl(ZEXT416((uint)fVar141),auVar29);
              if (auVar59._0_4_ < auVar58._0_4_) {
                bVar50 = uVar48 < 5;
                fVar126 = auVar60._0_4_ + (float)local_500._0_4_;
                auVar217 = ZEXT3264(local_620);
                auVar209 = ZEXT3264(local_640);
                bVar44 = 0;
                if ((fVar126 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar126))
                goto LAB_01822310;
                auVar60 = vmovshdup_avx(auVar60);
                fVar140 = auVar60._0_4_;
                bVar44 = 0;
                if ((fVar140 < 0.0) || (bVar44 = 0, 1.0 < fVar140)) goto LAB_01822310;
                auVar60 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_560._0_4_));
                fVar141 = auVar60._0_4_;
                pGVar3 = (context->scene->geometries).items[local_8c8].ptr;
                if ((pGVar3->mask & ray->mask) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar44 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01822310;
                  local_8c0._0_4_ = ray->tfar;
                  fVar141 = fVar141 * 1.5 +
                            (float)local_560._0_4_ * -0.5 * fVar141 * fVar141 * fVar141;
                  auVar181._0_4_ = fVar141 * (float)local_8a0._0_4_;
                  auVar181._4_4_ = fVar141 * (float)local_8a0._4_4_;
                  auVar181._8_4_ = fVar141 * fStack_898;
                  auVar181._12_4_ = fVar141 * fStack_894;
                  auVar61 = vfmadd213ps_fma(auVar61,auVar181,auVar63);
                  auVar60 = vshufps_avx(auVar181,auVar181,0xc9);
                  auVar58 = vshufps_avx(auVar63,auVar63,0xc9);
                  auVar182._0_4_ = auVar181._0_4_ * auVar58._0_4_;
                  auVar182._4_4_ = auVar181._4_4_ * auVar58._4_4_;
                  auVar182._8_4_ = auVar181._8_4_ * auVar58._8_4_;
                  auVar182._12_4_ = auVar181._12_4_ * auVar58._12_4_;
                  auVar59 = vfmsub231ps_fma(auVar182,auVar63,auVar60);
                  auVar60 = vshufps_avx(auVar59,auVar59,0xc9);
                  auVar58 = vshufps_avx(auVar61,auVar61,0xc9);
                  auVar59 = vshufps_avx(auVar59,auVar59,0xd2);
                  auVar120._0_4_ = auVar61._0_4_ * auVar59._0_4_;
                  auVar120._4_4_ = auVar61._4_4_ * auVar59._4_4_;
                  auVar120._8_4_ = auVar61._8_4_ * auVar59._8_4_;
                  auVar120._12_4_ = auVar61._12_4_ * auVar59._12_4_;
                  auVar58 = vfmsub231ps_fma(auVar120,auVar60,auVar58);
                  auVar60 = vshufps_avx(auVar58,auVar58,0xe9);
                  local_680 = vmovlps_avx(auVar60);
                  local_678 = auVar58._0_4_;
                  local_670 = 0;
                  local_66c = (undefined4)local_8d0;
                  local_668 = (undefined4)local_8c8;
                  local_664 = context->user->instID[0];
                  local_660 = context->user->instPrimID[0];
                  ray->tfar = fVar126;
                  local_8d4 = -1;
                  local_6b0.valid = &local_8d4;
                  local_6b0.geometryUserPtr = pGVar3->userPtr;
                  local_6b0.context = context->user;
                  local_6b0.hit = (RTCHitN *)&local_680;
                  local_6b0.N = 1;
                  local_8a0 = (undefined1  [8])pGVar3;
                  local_6b0.ray = (RTCRayN *)ray;
                  local_674 = fVar140;
                  if (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018225c0:
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)((long)local_8a0 + 0x3e) & 0x40) != 0)))) {
                      (*p_Var4)(&local_6b0);
                      auVar241 = ZEXT3264(local_720);
                      auVar238 = ZEXT3264(local_880);
                      auVar236 = ZEXT3264(local_860);
                      auVar235 = ZEXT3264(local_840);
                      auVar234 = ZEXT3264(local_820);
                      auVar233 = ZEXT3264(local_800);
                      auVar232 = ZEXT3264(local_7e0);
                      auVar231 = ZEXT3264(local_7c0);
                      auVar230 = ZEXT3264(local_7a0);
                      auVar242 = ZEXT3264(local_780);
                      auVar209 = ZEXT3264(local_640);
                      auVar217 = ZEXT3264(local_620);
                      auVar225 = ZEXT3264(local_600);
                      auVar223 = ZEXT3264(local_5e0);
                      auVar221 = ZEXT3264(local_5c0);
                      auVar239 = ZEXT3264(local_760);
                      auVar237 = ZEXT3264(local_6e0);
                      auVar240 = ZEXT3264(local_700);
                      if (*local_6b0.valid == 0) goto LAB_018226a1;
                    }
                    bVar44 = 1;
                    goto LAB_01822310;
                  }
                  (*pGVar3->occlusionFilterN)(&local_6b0);
                  auVar241 = ZEXT3264(local_720);
                  auVar238 = ZEXT3264(local_880);
                  auVar236 = ZEXT3264(local_860);
                  auVar235 = ZEXT3264(local_840);
                  auVar234 = ZEXT3264(local_820);
                  auVar233 = ZEXT3264(local_800);
                  auVar232 = ZEXT3264(local_7e0);
                  auVar231 = ZEXT3264(local_7c0);
                  auVar230 = ZEXT3264(local_7a0);
                  auVar242 = ZEXT3264(local_780);
                  auVar209 = ZEXT3264(local_640);
                  auVar217 = ZEXT3264(local_620);
                  auVar225 = ZEXT3264(local_600);
                  auVar223 = ZEXT3264(local_5e0);
                  auVar221 = ZEXT3264(local_5c0);
                  auVar239 = ZEXT3264(local_760);
                  auVar237 = ZEXT3264(local_6e0);
                  auVar240 = ZEXT3264(local_700);
                  if (*local_6b0.valid != 0) goto LAB_018225c0;
LAB_018226a1:
                  ray->tfar = (float)local_8c0._0_4_;
                }
                bVar44 = 0;
                goto LAB_01822310;
              }
            }
            uVar48 = uVar48 + 1;
            auVar217 = ZEXT3264(local_620);
            auVar209 = ZEXT3264(local_640);
          }
          bVar50 = false;
LAB_01822310:
          bVar49 = bVar49 | bVar50 & bVar44;
          fVar140 = ray->tfar;
          fVar126 = ray->tfar;
          auVar34._4_4_ = fVar126;
          auVar34._0_4_ = fVar126;
          auVar34._8_4_ = fVar126;
          auVar34._12_4_ = fVar126;
          auVar34._16_4_ = fVar126;
          auVar34._20_4_ = fVar126;
          auVar34._24_4_ = fVar126;
          auVar34._28_4_ = fVar126;
          uVar14 = vcmpps_avx512vl(_local_320,auVar34,2);
        }
        uVar16 = vpcmpd_avx512vl(local_2c0,local_220,1);
        uVar15 = vpcmpd_avx512vl(local_2c0,_local_340,1);
        auVar165._0_4_ = (float)local_360._0_4_ + (float)local_260._0_4_;
        auVar165._4_4_ = (float)local_360._4_4_ + (float)local_260._4_4_;
        auVar165._8_4_ = fStack_358 + fStack_258;
        auVar165._12_4_ = fStack_354 + fStack_254;
        auVar165._16_4_ = fStack_350 + fStack_250;
        auVar165._20_4_ = fStack_34c + fStack_24c;
        auVar165._24_4_ = fStack_348 + fStack_248;
        auVar165._28_4_ = fStack_344 + fStack_244;
        auVar184._4_4_ = fVar140;
        auVar184._0_4_ = fVar140;
        auVar184._8_4_ = fVar140;
        auVar184._12_4_ = fVar140;
        auVar184._16_4_ = fVar140;
        auVar184._20_4_ = fVar140;
        auVar184._24_4_ = fVar140;
        auVar184._28_4_ = fVar140;
        uVar14 = vcmpps_avx512vl(auVar165,auVar184,2);
        bVar46 = (byte)local_724 & (byte)uVar16 & (byte)uVar14;
        auVar166._0_4_ = (float)local_360._0_4_ + (float)local_2a0._0_4_;
        auVar166._4_4_ = (float)local_360._4_4_ + (float)local_2a0._4_4_;
        auVar166._8_4_ = fStack_358 + fStack_298;
        auVar166._12_4_ = fStack_354 + fStack_294;
        auVar166._16_4_ = fStack_350 + fStack_290;
        auVar166._20_4_ = fStack_34c + fStack_28c;
        auVar166._24_4_ = fStack_348 + fStack_288;
        auVar166._28_4_ = fStack_344 + fStack_284;
        uVar14 = vcmpps_avx512vl(auVar166,auVar184,2);
        bVar43 = bVar43 & (byte)uVar15 & (byte)uVar14 | bVar46;
        if (bVar43 != 0) {
          uVar48 = (ulong)uVar45;
          abStack_180[uVar48 * 0x60] = bVar43;
          bVar50 = (bool)(bVar46 >> 1 & 1);
          bVar5 = (bool)(bVar46 >> 2 & 1);
          bVar6 = (bool)(bVar46 >> 3 & 1);
          bVar7 = (bool)(bVar46 >> 4 & 1);
          bVar8 = (bool)(bVar46 >> 5 & 1);
          bVar9 = (bool)(bVar46 >> 6 & 1);
          auStack_160[uVar48 * 0x18] =
               (uint)(bVar46 & 1) * local_260._0_4_ | (uint)!(bool)(bVar46 & 1) * local_2a0._0_4_;
          auStack_160[uVar48 * 0x18 + 1] =
               (uint)bVar50 * local_260._4_4_ | (uint)!bVar50 * local_2a0._4_4_;
          auStack_160[uVar48 * 0x18 + 2] =
               (uint)bVar5 * (int)fStack_258 | (uint)!bVar5 * (int)fStack_298;
          auStack_160[uVar48 * 0x18 + 3] =
               (uint)bVar6 * (int)fStack_254 | (uint)!bVar6 * (int)fStack_294;
          auStack_160[uVar48 * 0x18 + 4] =
               (uint)bVar7 * (int)fStack_250 | (uint)!bVar7 * (int)fStack_290;
          auStack_160[uVar48 * 0x18 + 5] =
               (uint)bVar8 * (int)fStack_24c | (uint)!bVar8 * (int)fStack_28c;
          auStack_160[uVar48 * 0x18 + 6] =
               (uint)bVar9 * (int)fStack_248 | (uint)!bVar9 * (int)fStack_288;
          auStack_160[uVar48 * 0x18 + 7] =
               (uint)(bVar46 >> 7) * (int)fStack_244 | (uint)!(bool)(bVar46 >> 7) * (int)fStack_284;
          uVar53 = vmovlps_avx(local_2d0);
          (&uStack_140)[uVar48 * 0xc] = uVar53;
          aiStack_138[uVar48 * 0x18] = local_8ec + 1;
          uVar45 = uVar45 + 1;
        }
        auVar193 = ZEXT3264(local_4a0);
        prim = local_650;
      }
    }
    fVar140 = ray->tfar;
    fVar126 = ray->tfar;
    auVar135._4_4_ = fVar126;
    auVar135._0_4_ = fVar126;
    auVar135._8_4_ = fVar126;
    auVar135._12_4_ = fVar126;
    auVar135._16_4_ = fVar126;
    auVar135._20_4_ = fVar126;
    auVar135._24_4_ = fVar126;
    auVar135._28_4_ = fVar126;
    do {
      uVar54 = uVar45;
      uVar104 = uVar54 - 1;
      if (uVar54 == 0) {
        if (bVar49 != 0) goto LAB_01822840;
        auVar121._4_4_ = fVar140;
        auVar121._0_4_ = fVar140;
        auVar121._8_4_ = fVar140;
        auVar121._12_4_ = fVar140;
        uVar14 = vcmpps_avx512vl(auVar121,local_2e0,0xd);
        local_648 = (ulong)((uint)local_4a8 & (uint)uVar14);
        goto LAB_0182019e;
      }
      uVar53 = (ulong)uVar104;
      auVar68 = *(undefined1 (*) [32])(auStack_160 + uVar53 * 0x18);
      auVar183._0_4_ = auVar68._0_4_ + (float)local_360._0_4_;
      auVar183._4_4_ = auVar68._4_4_ + (float)local_360._4_4_;
      auVar183._8_4_ = auVar68._8_4_ + fStack_358;
      auVar183._12_4_ = auVar68._12_4_ + fStack_354;
      auVar183._16_4_ = auVar68._16_4_ + fStack_350;
      auVar183._20_4_ = auVar68._20_4_ + fStack_34c;
      auVar183._24_4_ = auVar68._24_4_ + fStack_348;
      auVar183._28_4_ = auVar68._28_4_ + fStack_344;
      uVar14 = vcmpps_avx512vl(auVar183,auVar135,2);
      uVar105 = (uint)uVar14 & (uint)abStack_180[uVar53 * 0x60];
      uVar45 = uVar104;
    } while (uVar105 == 0);
    uVar48 = (&uStack_140)[uVar53 * 0xc];
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar48;
    auVar136._8_4_ = 0x7f800000;
    auVar136._0_8_ = 0x7f8000007f800000;
    auVar136._12_4_ = 0x7f800000;
    auVar136._16_4_ = 0x7f800000;
    auVar136._20_4_ = 0x7f800000;
    auVar136._24_4_ = 0x7f800000;
    auVar136._28_4_ = 0x7f800000;
    auVar68 = vblendmps_avx512vl(auVar136,auVar68);
    bVar43 = (byte)uVar105;
    auVar101._0_4_ = (uint)(bVar43 & 1) * auVar68._0_4_ | (uint)!(bool)(bVar43 & 1) * 0x7f800000;
    bVar50 = (bool)((byte)(uVar105 >> 1) & 1);
    auVar101._4_4_ = (uint)bVar50 * auVar68._4_4_ | (uint)!bVar50 * 0x7f800000;
    bVar50 = (bool)((byte)(uVar105 >> 2) & 1);
    auVar101._8_4_ = (uint)bVar50 * auVar68._8_4_ | (uint)!bVar50 * 0x7f800000;
    bVar50 = (bool)((byte)(uVar105 >> 3) & 1);
    auVar101._12_4_ = (uint)bVar50 * auVar68._12_4_ | (uint)!bVar50 * 0x7f800000;
    bVar50 = (bool)((byte)(uVar105 >> 4) & 1);
    auVar101._16_4_ = (uint)bVar50 * auVar68._16_4_ | (uint)!bVar50 * 0x7f800000;
    bVar50 = (bool)((byte)(uVar105 >> 5) & 1);
    auVar101._20_4_ = (uint)bVar50 * auVar68._20_4_ | (uint)!bVar50 * 0x7f800000;
    bVar50 = (bool)((byte)(uVar105 >> 6) & 1);
    auVar101._24_4_ = (uint)bVar50 * auVar68._24_4_ | (uint)!bVar50 * 0x7f800000;
    auVar101._28_4_ = (uVar105 >> 7) * auVar68._28_4_ | (uint)!SUB41(uVar105 >> 7,0) * 0x7f800000;
    auVar68 = vshufps_avx(auVar101,auVar101,0xb1);
    auVar68 = vminps_avx(auVar101,auVar68);
    auVar67 = vshufpd_avx(auVar68,auVar68,5);
    auVar68 = vminps_avx(auVar68,auVar67);
    auVar67 = vpermpd_avx2(auVar68,0x4e);
    auVar68 = vminps_avx(auVar68,auVar67);
    uVar14 = vcmpps_avx512vl(auVar101,auVar68,0);
    bVar46 = (byte)uVar14 & bVar43;
    if (bVar46 != 0) {
      uVar105 = (uint)bVar46;
    }
    uVar106 = 0;
    for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x80000000) {
      uVar106 = uVar106 + 1;
    }
    local_8ec = aiStack_138[uVar53 * 0x18];
    bVar43 = ~('\x01' << ((byte)uVar106 & 0x1f)) & bVar43;
    abStack_180[uVar53 * 0x60] = bVar43;
    uVar45 = uVar54;
    if (bVar43 == 0) {
      uVar45 = uVar104;
    }
    uVar111 = (undefined4)uVar48;
    auVar137._4_4_ = uVar111;
    auVar137._0_4_ = uVar111;
    auVar137._8_4_ = uVar111;
    auVar137._12_4_ = uVar111;
    auVar137._16_4_ = uVar111;
    auVar137._20_4_ = uVar111;
    auVar137._24_4_ = uVar111;
    auVar137._28_4_ = uVar111;
    auVar60 = vmovshdup_avx(auVar114);
    auVar60 = vsubps_avx(auVar60,auVar114);
    auVar122._0_4_ = auVar60._0_4_;
    auVar122._4_4_ = auVar122._0_4_;
    auVar122._8_4_ = auVar122._0_4_;
    auVar122._12_4_ = auVar122._0_4_;
    auVar122._16_4_ = auVar122._0_4_;
    auVar122._20_4_ = auVar122._0_4_;
    auVar122._24_4_ = auVar122._0_4_;
    auVar122._28_4_ = auVar122._0_4_;
    auVar60 = vfmadd132ps_fma(auVar122,auVar137,_DAT_01f7b040);
    _local_260 = ZEXT1632(auVar60);
    local_2d0._8_8_ = 0;
    local_2d0._0_8_ = *(ulong *)(local_260 + (ulong)uVar106 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }